

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

Matrix<double,_1,_197,_1,_1,_197> *
opengv::relative_pose::modules::fivept_kneip::initEpncpRowR
          (Matrix<double,_1,_197,_1,_1,_197> *__return_storage_ptr__,
          vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *c123_1,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *c123_2)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer pMVar11;
  pointer pMVar12;
  undefined1 auVar13 [16];
  ActualDstType actualDst;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  
  memset(__return_storage_ptr__,0,0x628);
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar290._8_8_ = 0;
  auVar290._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar422._8_8_ = 0;
  auVar422._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar2;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar662,auVar290,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar777._8_8_ = 0;
  auVar777._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar777,auVar290);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar422,auVar777);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar15,auVar546);
  auVar13 = vfmadd231sd_fma(auVar13,auVar15,auVar422);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar291._8_8_ = 0;
  auVar291._0_8_ = dVar2;
  auVar423._8_8_ = 0;
  auVar423._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar547._8_8_ = 0;
  auVar547._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar547,auVar423,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar663._8_8_ = 0;
  auVar663._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar778._8_8_ = 0;
  auVar778._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfmadd231sd_fma(auVar13,auVar663,auVar778);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar663,auVar291);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar17,auVar778);
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar423);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[1] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar292._8_8_ = 0;
  auVar292._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar424._8_8_ = 0;
  auVar424._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar548._8_8_ = 0;
  auVar548._0_8_ = dVar2;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar664,auVar292,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar779._8_8_ = 0;
  auVar779._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar779,auVar292);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar424,auVar779);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar19,auVar548);
  auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar424);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[2] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  auVar293._8_8_ = 0;
  auVar293._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar425._8_8_ = 0;
  auVar425._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar549._8_8_ = 0;
  auVar549._0_8_ = dVar2;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = dVar2 * dVar1;
  auVar13 = vfnmsub231sd_fma(auVar665,auVar20,auVar293);
  auVar780._8_8_ = 0;
  auVar780._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar20,auVar780);
  auVar13 = vfmadd231sd_fma(auVar13,auVar425,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar902._8_8_ = 0;
  auVar902._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar928._8_8_ = 0;
  auVar928._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar902,auVar928);
  auVar947._8_8_ = 0;
  auVar947._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar902,auVar947);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar902,auVar780);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar902,auVar425);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar21,auVar928);
  auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar293);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar21,auVar947);
  auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar549);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[3] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar2;
  auVar426._8_8_ = 0;
  auVar426._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar550._8_8_ = 0;
  auVar550._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar550,auVar426,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar666._8_8_ = 0;
  auVar666._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar781._8_8_ = 0;
  auVar781._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar666,auVar781);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar666,auVar294);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar23,auVar781);
  auVar13 = vfmadd231sd_fma(auVar13,auVar23,auVar426);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[4] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1;
  auVar295._8_8_ = 0;
  auVar295._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar427._8_8_ = 0;
  auVar427._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar2;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar667,auVar295,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar782._8_8_ = 0;
  auVar782._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar782,auVar295);
  auVar13 = vfmadd231sd_fma(auVar13,auVar427,auVar782);
  auVar13 = vfmadd231sd_fma(auVar13,auVar25,auVar551);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar25,auVar427);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[5] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1;
  auVar296._8_8_ = 0;
  auVar296._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar428._8_8_ = 0;
  auVar428._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar552._8_8_ = 0;
  auVar552._0_8_ = dVar2;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar668,auVar296,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar783._8_8_ = 0;
  auVar783._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar783,auVar296);
  auVar13 = vfmadd231sd_fma(auVar13,auVar428,auVar783);
  auVar13 = vfmadd231sd_fma(auVar13,auVar27,auVar552);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar27,auVar428);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[6] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  auVar297._8_8_ = 0;
  auVar297._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar429._8_8_ = 0;
  auVar429._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar2;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar669,auVar297,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar784._8_8_ = 0;
  auVar784._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar784,auVar297);
  auVar13 = vfmadd231sd_fma(auVar13,auVar429,auVar784);
  auVar13 = vfmadd231sd_fma(auVar13,auVar29,auVar553);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar29,auVar429);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[7] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar298._8_8_ = 0;
  auVar298._0_8_ = dVar2;
  auVar430._8_8_ = 0;
  auVar430._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar554,auVar430,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar670._8_8_ = 0;
  auVar670._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar785._8_8_ = 0;
  auVar785._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar670,auVar785);
  auVar13 = vfmadd231sd_fma(auVar13,auVar670,auVar298);
  auVar13 = vfmadd231sd_fma(auVar13,auVar31,auVar785);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar31,auVar430);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[8] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar299._8_8_ = 0;
  auVar299._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar431._8_8_ = 0;
  auVar431._0_8_ = dVar2;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar555,auVar32,auVar299);
  auVar671._8_8_ = 0;
  auVar671._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar786._8_8_ = 0;
  auVar786._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar32,auVar786);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar671,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar903._8_8_ = 0;
  auVar903._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar929._8_8_ = 0;
  auVar929._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar903,auVar929);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar903,auVar431);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar903,auVar786);
  auVar432._8_8_ = 0;
  auVar432._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar432,auVar903);
  auVar13 = vfmadd231sd_fma(auVar13,auVar33,auVar299);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar33,auVar929);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar33,auVar432);
  auVar13 = vfmadd231sd_fma(auVar13,auVar33,auVar671);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[10] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1;
  auVar300._8_8_ = 0;
  auVar300._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar433._8_8_ = 0;
  auVar433._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar2;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar672,auVar300,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar787._8_8_ = 0;
  auVar787._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar787,auVar300);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar433,auVar787);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar35,auVar556);
  auVar13 = vfmadd231sd_fma(auVar13,auVar35,auVar433);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xb] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = dVar2;
  auVar434._8_8_ = 0;
  auVar434._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar557._8_8_ = 0;
  auVar557._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar557,auVar434,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar673._8_8_ = 0;
  auVar673._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar788._8_8_ = 0;
  auVar788._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar673,auVar788);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar673,auVar301);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar37,auVar788);
  auVar13 = vfmadd231sd_fma(auVar13,auVar37,auVar434);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xc] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1;
  auVar302._8_8_ = 0;
  auVar302._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar435._8_8_ = 0;
  auVar435._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar558._8_8_ = 0;
  auVar558._0_8_ = dVar2;
  auVar674._8_8_ = 0;
  auVar674._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar674,auVar302,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar789._8_8_ = 0;
  auVar789._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar789,auVar302);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar435,auVar789);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar39,auVar558);
  auVar13 = vfmadd231sd_fma(auVar13,auVar39,auVar435);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xd] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = dVar2;
  auVar436._8_8_ = 0;
  auVar436._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar559._8_8_ = 0;
  auVar559._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar559,auVar436,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar675._8_8_ = 0;
  auVar675._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar790._8_8_ = 0;
  auVar790._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar675,auVar790);
  auVar13 = vfmadd231sd_fma(auVar13,auVar675,auVar303);
  auVar13 = vfmadd231sd_fma(auVar13,auVar41,auVar790);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar41,auVar436);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xe] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1;
  auVar304._8_8_ = 0;
  auVar304._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar437._8_8_ = 0;
  auVar437._0_8_ = dVar2;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = dVar1 * dVar2;
  auVar13 = vfmadd231sd_fma(auVar560,auVar42,auVar304);
  auVar676._8_8_ = 0;
  auVar676._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar42,auVar676);
  auVar791._8_8_ = 0;
  auVar791._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar791,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar904._8_8_ = 0;
  auVar904._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar904,auVar304);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar904,auVar437);
  auVar305._8_8_ = 0;
  auVar305._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar438._8_8_ = 0;
  auVar438._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar904,auVar438);
  auVar13 = vfmadd231sd_fma(auVar13,auVar305,auVar904);
  auVar13 = vfmadd231sd_fma(auVar13,auVar43,auVar676);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar43,auVar438);
  auVar13 = vfmadd231sd_fma(auVar13,auVar43,auVar791);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar43,auVar305);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xf] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = dVar2;
  auVar439._8_8_ = 0;
  auVar439._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar561._8_8_ = 0;
  auVar561._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar561,auVar439,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar677._8_8_ = 0;
  auVar677._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar792._8_8_ = 0;
  auVar792._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfmadd231sd_fma(auVar13,auVar677,auVar792);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar677,auVar306);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar45,auVar792);
  auVar13 = vfmadd231sd_fma(auVar13,auVar45,auVar439);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x10] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1;
  auVar307._8_8_ = 0;
  auVar307._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar440._8_8_ = 0;
  auVar440._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar2;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar678,auVar307,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar793._8_8_ = 0;
  auVar793._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar793,auVar307);
  auVar13 = vfmadd231sd_fma(auVar13,auVar440,auVar793);
  auVar13 = vfmadd231sd_fma(auVar13,auVar47,auVar562);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar47,auVar440);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x12] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1;
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar441._8_8_ = 0;
  auVar441._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar563._8_8_ = 0;
  auVar563._0_8_ = dVar2;
  auVar679._8_8_ = 0;
  auVar679._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar679,auVar308,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar794._8_8_ = 0;
  auVar794._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar794,auVar308);
  auVar13 = vfmadd231sd_fma(auVar13,auVar441,auVar794);
  auVar13 = vfmadd231sd_fma(auVar13,auVar49,auVar563);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar49,auVar441);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x13] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1;
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar442._8_8_ = 0;
  auVar442._0_8_ = dVar2;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = dVar1 * dVar2;
  auVar13 = vfmadd231sd_fma(auVar564,auVar50,auVar309);
  auVar680._8_8_ = 0;
  auVar680._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar50,auVar680);
  auVar795._8_8_ = 0;
  auVar795._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar795,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar905._8_8_ = 0;
  auVar905._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar905,auVar309);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar905,auVar442);
  auVar310._8_8_ = 0;
  auVar310._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar443._8_8_ = 0;
  auVar443._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar905,auVar443);
  auVar13 = vfmadd231sd_fma(auVar13,auVar310,auVar905);
  auVar13 = vfmadd231sd_fma(auVar13,auVar51,auVar680);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar51,auVar443);
  auVar13 = vfmadd231sd_fma(auVar13,auVar51,auVar795);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar51,auVar310);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x14] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar1;
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar444._8_8_ = 0;
  auVar444._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar565._8_8_ = 0;
  auVar565._0_8_ = dVar2;
  auVar681._8_8_ = 0;
  auVar681._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar681,auVar311,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar796._8_8_ = 0;
  auVar796._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar796,auVar311);
  auVar13 = vfmadd231sd_fma(auVar13,auVar444,auVar796);
  auVar13 = vfmadd231sd_fma(auVar13,auVar53,auVar565);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar53,auVar444);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x15] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar2;
  auVar445._8_8_ = 0;
  auVar445._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar566._8_8_ = 0;
  auVar566._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar566,auVar445,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar682._8_8_ = 0;
  auVar682._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar797._8_8_ = 0;
  auVar797._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar682,auVar797);
  auVar13 = vfmadd231sd_fma(auVar13,auVar682,auVar312);
  auVar13 = vfmadd231sd_fma(auVar13,auVar55,auVar797);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar55,auVar445);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x16] = auVar13._0_8_;
  dVar1 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar2;
  auVar446._8_8_ = 0;
  auVar446._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar567._8_8_ = 0;
  auVar567._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar567,auVar446,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar683._8_8_ = 0;
  auVar683._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar798._8_8_ = 0;
  auVar798._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar683,auVar798);
  auVar13 = vfmadd231sd_fma(auVar13,auVar683,auVar313);
  auVar13 = vfmadd231sd_fma(auVar13,auVar57,auVar798);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar57,auVar446);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x17] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1;
  auVar314._8_8_ = 0;
  auVar314._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar447._8_8_ = 0;
  auVar447._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar2;
  auVar684._8_8_ = 0;
  auVar684._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar684,auVar314,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar799._8_8_ = 0;
  auVar799._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar799,auVar314);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar447,auVar799);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar59,auVar568);
  auVar13 = vfmadd231sd_fma(auVar13,auVar59,auVar447);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x19] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1;
  auVar315._8_8_ = 0;
  auVar315._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar448._8_8_ = 0;
  auVar448._0_8_ = dVar2;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar569,auVar60,auVar315);
  auVar685._8_8_ = 0;
  auVar685._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar800._8_8_ = 0;
  auVar800._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar60,auVar800);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar685,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar906._8_8_ = 0;
  auVar906._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar930._8_8_ = 0;
  auVar930._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar906,auVar930);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar906,auVar448);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar906,auVar800);
  auVar449._8_8_ = 0;
  auVar449._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar449,auVar906);
  auVar13 = vfmadd231sd_fma(auVar13,auVar61,auVar315);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar61,auVar930);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar61,auVar449);
  auVar13 = vfmadd231sd_fma(auVar13,auVar61,auVar685);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1a] = auVar13._0_8_;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar2;
  auVar450._8_8_ = 0;
  auVar450._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar570,auVar450,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar686._8_8_ = 0;
  auVar686._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar801._8_8_ = 0;
  auVar801._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar686,auVar801);
  auVar13 = vfmadd231sd_fma(auVar13,auVar686,auVar316);
  auVar13 = vfmadd231sd_fma(auVar13,auVar63,auVar801);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar63,auVar450);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1b] = auVar13._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar451._8_8_ = 0;
  auVar451._0_8_ =
       dVar1 * *(double *)
                ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x38);
  auVar13 = vfnmsub231sd_fma(auVar451,auVar317,auVar13);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar317,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar317,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar64,auVar5);
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar318._8_8_ = 0;
  auVar318._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar571._8_8_ = 0;
  auVar571._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar318,auVar571);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar318,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + 0x28);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar318,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar65,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar65,auVar9);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar65,auVar571);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar65,auVar10);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar319._8_8_ = 0;
  auVar319._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar452._8_8_ = 0;
  auVar452._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar572._8_8_ = 0;
  auVar572._0_8_ = dVar2;
  auVar687._8_8_ = 0;
  auVar687._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar687,auVar319,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar802._8_8_ = 0;
  auVar802._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar802,auVar319);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar452,auVar802);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar67,auVar572);
  auVar13 = vfmadd231sd_fma(auVar13,auVar67,auVar452);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar2;
  auVar453._8_8_ = 0;
  auVar453._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar573,auVar453,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar688._8_8_ = 0;
  auVar688._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar803._8_8_ = 0;
  auVar803._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar688,auVar803);
  auVar13 = vfmadd231sd_fma(auVar13,auVar688,auVar320);
  auVar13 = vfmadd231sd_fma(auVar13,auVar69,auVar803);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar69,auVar453);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar2;
  auVar454._8_8_ = 0;
  auVar454._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar574,auVar454,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar689._8_8_ = 0;
  auVar689._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar804._8_8_ = 0;
  auVar804._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar689,auVar804);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar689,auVar321);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar71,auVar804);
  auVar13 = vfmadd231sd_fma(auVar13,auVar71,auVar454);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x21] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar2;
  auVar455._8_8_ = 0;
  auVar455._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar575._8_8_ = 0;
  auVar575._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar575,auVar455,auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar690._8_8_ = 0;
  auVar690._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar805._8_8_ = 0;
  auVar805._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar690,auVar805);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar690,auVar322);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar73,auVar805);
  auVar13 = vfmadd231sd_fma(auVar13,auVar73,auVar455);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x22] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar2;
  auVar456._8_8_ = 0;
  auVar456._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar576,auVar456,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar691._8_8_ = 0;
  auVar691._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar806._8_8_ = 0;
  auVar806._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar691,auVar806);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar691,auVar323);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar75,auVar806);
  auVar13 = vfmadd231sd_fma(auVar13,auVar75,auVar456);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x27] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar457._8_8_ = 0;
  auVar457._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar2;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar692,auVar324,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar807._8_8_ = 0;
  auVar807._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar807,auVar324);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar457,auVar807);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar77,auVar577);
  auVar13 = vfmadd231sd_fma(auVar13,auVar77,auVar457);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x28] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar2;
  auVar458._8_8_ = 0;
  auVar458._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar578,auVar458,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar693._8_8_ = 0;
  auVar693._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar808._8_8_ = 0;
  auVar808._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar693,auVar808);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar693,auVar325);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar79,auVar808);
  auVar13 = vfmadd231sd_fma(auVar13,auVar79,auVar458);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x29] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar326._8_8_ = 0;
  auVar326._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar2;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar579,auVar80,auVar326);
  auVar694._8_8_ = 0;
  auVar694._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar80,auVar694);
  auVar809._8_8_ = 0;
  auVar809._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar907._8_8_ = 0;
  auVar907._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar907,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar931._8_8_ = 0;
  auVar931._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar931,auVar326);
  auVar13 = vfmadd231sd_fma(auVar13,auVar931,auVar694);
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar931,auVar327);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar809,auVar931);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar81,auVar459);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar81,auVar907);
  auVar13 = vfmadd231sd_fma(auVar13,auVar81,auVar327);
  auVar13 = vfmadd231sd_fma(auVar13,auVar81,auVar809);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2a] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar460._8_8_ = 0;
  auVar460._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar2;
  auVar695._8_8_ = 0;
  auVar695._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar695,auVar328,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar810._8_8_ = 0;
  auVar810._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar810,auVar328);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar460,auVar810);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar83,auVar580);
  auVar13 = vfmadd231sd_fma(auVar13,auVar83,auVar460);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2b] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar329._8_8_ = 0;
  auVar329._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar461._8_8_ = 0;
  auVar461._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar581._8_8_ = 0;
  auVar581._0_8_ = dVar2;
  auVar696._8_8_ = 0;
  auVar696._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar696,auVar329,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar85,auVar329);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar461,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar86,auVar329);
  auVar13 = vfmadd231sd_fma(auVar13,auVar581,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar811._8_8_ = 0;
  auVar811._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar811,auVar329);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar461,auVar811);
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar330,auVar581);
  auVar13 = vfmadd231sd_fma(auVar13,auVar461,auVar330);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar87,auVar581);
  auVar13 = vfmadd231sd_fma(auVar13,auVar87,auVar461);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar331._8_8_ = 0;
  auVar331._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar462._8_8_ = 0;
  auVar462._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar582._8_8_ = 0;
  auVar582._0_8_ = dVar2;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar697,auVar331,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar89,auVar331);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar462,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar90,auVar331);
  auVar13 = vfmadd231sd_fma(auVar13,auVar582,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar812._8_8_ = 0;
  auVar812._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar812,auVar331);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar462,auVar812);
  auVar332._8_8_ = 0;
  auVar332._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar332,auVar582);
  auVar13 = vfmadd231sd_fma(auVar13,auVar462,auVar332);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar91,auVar582);
  auVar13 = vfmadd231sd_fma(auVar13,auVar91,auVar462);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar333._8_8_ = 0;
  auVar333._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar463._8_8_ = 0;
  auVar463._0_8_ = dVar2;
  auVar583._8_8_ = 0;
  auVar583._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar698._8_8_ = 0;
  auVar698._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar698,auVar333,auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar93,auVar333);
  auVar13 = vfmadd231sd_fma(auVar13,auVar583,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar94,auVar583);
  auVar13 = vfmadd231sd_fma(auVar13,auVar463,auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar813._8_8_ = 0;
  auVar813._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar813,auVar583);
  auVar13 = vfmadd231sd_fma(auVar13,auVar463,auVar813);
  auVar814._8_8_ = 0;
  auVar814._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar814,auVar333);
  auVar13 = vfmadd231sd_fma(auVar13,auVar814,auVar583);
  auVar13 = vfmadd231sd_fma(auVar13,auVar95,auVar333);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar95,auVar463);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar334._8_8_ = 0;
  auVar334._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar464._8_8_ = 0;
  auVar464._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar584._8_8_ = 0;
  auVar584._0_8_ = dVar2;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar699,auVar334,auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar97,auVar334);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar584,auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar98,auVar334);
  auVar13 = vfmadd231sd_fma(auVar13,auVar464,auVar98);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar815._8_8_ = 0;
  auVar815._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar815,auVar584);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar464,auVar815);
  auVar816._8_8_ = 0;
  auVar816._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar816,auVar334);
  auVar13 = vfmadd231sd_fma(auVar13,auVar464,auVar816);
  auVar13 = vfmadd231sd_fma(auVar13,auVar99,auVar584);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar99,auVar464);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2f] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar335._8_8_ = 0;
  auVar335._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar465._8_8_ = 0;
  auVar465._0_8_ = dVar2;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar585,auVar335,auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar700._8_8_ = 0;
  auVar700._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar101,auVar700);
  auVar817._8_8_ = 0;
  auVar817._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar908._8_8_ = 0;
  auVar908._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar908,auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar102,auVar700);
  auVar701._8_8_ = 0;
  auVar701._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar701,auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar932._8_8_ = 0;
  auVar932._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar932,auVar335);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar817,auVar932);
  auVar336._8_8_ = 0;
  auVar336._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar336,auVar465);
  auVar13 = vfmadd231sd_fma(auVar13,auVar336,auVar817);
  auVar13 = vfmadd231sd_fma(auVar13,auVar103,auVar908);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar103,auVar701);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x30] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar2;
  auVar466._8_8_ = 0;
  auVar466._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar586._8_8_ = 0;
  auVar586._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar586,auVar466,auVar104);
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar702._8_8_ = 0;
  auVar702._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar818._8_8_ = 0;
  auVar818._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar702,auVar818);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar702,auVar337);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar105,auVar818);
  auVar13 = vfmadd231sd_fma(auVar13,auVar105,auVar466);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x31] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar338._8_8_ = 0;
  auVar338._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar467._8_8_ = 0;
  auVar467._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar587._8_8_ = 0;
  auVar587._0_8_ = dVar2;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar703,auVar338,auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar819._8_8_ = 0;
  auVar819._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar819,auVar338);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar467,auVar819);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar107,auVar587);
  auVar13 = vfmadd231sd_fma(auVar13,auVar107,auVar467);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x32] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar339._8_8_ = 0;
  auVar339._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar468._8_8_ = 0;
  auVar468._0_8_ = dVar2;
  auVar588._8_8_ = 0;
  auVar588._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar704._8_8_ = 0;
  auVar704._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar704,auVar339,auVar108);
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar109,auVar339);
  auVar13 = vfmadd231sd_fma(auVar13,auVar588,auVar109);
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar110,auVar588);
  auVar13 = vfmadd231sd_fma(auVar13,auVar468,auVar110);
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar820._8_8_ = 0;
  auVar820._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar820,auVar588);
  auVar13 = vfmadd231sd_fma(auVar13,auVar468,auVar820);
  auVar821._8_8_ = 0;
  auVar821._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar821,auVar339);
  auVar13 = vfmadd231sd_fma(auVar13,auVar821,auVar588);
  auVar13 = vfmadd231sd_fma(auVar13,auVar111,auVar339);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar111,auVar468);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x33] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar340._8_8_ = 0;
  auVar340._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar469._8_8_ = 0;
  auVar469._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar589._8_8_ = 0;
  auVar589._0_8_ = dVar2;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar705,auVar340,auVar112);
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar822._8_8_ = 0;
  auVar822._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar113,auVar822);
  auVar909._8_8_ = 0;
  auVar909._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar909,auVar113);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar114,auVar909);
  auVar13 = vfmadd231sd_fma(auVar13,auVar469,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar910._8_8_ = 0;
  auVar910._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar910,auVar589);
  auVar590._8_8_ = 0;
  auVar590._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar590,auVar910);
  auVar911._8_8_ = 0;
  auVar911._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar911,auVar340);
  auVar13 = vfmadd231sd_fma(auVar13,auVar911,auVar590);
  auVar13 = vfmadd231sd_fma(auVar13,auVar115,auVar822);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar115,auVar469);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x34] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar341._8_8_ = 0;
  auVar341._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar470._8_8_ = 0;
  auVar470._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar591._8_8_ = 0;
  auVar591._0_8_ = dVar2;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar706,auVar341,auVar116);
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar117,auVar341);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar591,auVar117);
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar118,auVar341);
  auVar13 = vfmadd231sd_fma(auVar13,auVar470,auVar118);
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar823._8_8_ = 0;
  auVar823._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar823,auVar591);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar470,auVar823);
  auVar824._8_8_ = 0;
  auVar824._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar824,auVar341);
  auVar13 = vfmadd231sd_fma(auVar13,auVar470,auVar824);
  auVar13 = vfmadd231sd_fma(auVar13,auVar119,auVar591);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar119,auVar470);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x35] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar2;
  auVar471._8_8_ = 0;
  auVar471._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar592,auVar471,auVar120);
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar707._8_8_ = 0;
  auVar707._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar825._8_8_ = 0;
  auVar825._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar707,auVar825);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar707,auVar342);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar121,auVar825);
  auVar13 = vfmadd231sd_fma(auVar13,auVar121,auVar471);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x36] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar343._8_8_ = 0;
  auVar343._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar472._8_8_ = 0;
  auVar472._0_8_ = dVar2;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar593,auVar122,auVar343);
  auVar708._8_8_ = 0;
  auVar708._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar122,auVar708);
  auVar826._8_8_ = 0;
  auVar826._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar912._8_8_ = 0;
  auVar912._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar912,auVar122);
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar933._8_8_ = 0;
  auVar933._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar933,auVar343);
  auVar13 = vfmadd231sd_fma(auVar13,auVar933,auVar708);
  auVar344._8_8_ = 0;
  auVar344._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar933,auVar344);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar826,auVar933);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar123,auVar472);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar123,auVar912);
  auVar13 = vfmadd231sd_fma(auVar13,auVar123,auVar344);
  auVar13 = vfmadd231sd_fma(auVar13,auVar123,auVar826);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x37] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar345._8_8_ = 0;
  auVar345._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar473._8_8_ = 0;
  auVar473._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar2;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar709,auVar345,auVar124);
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar827._8_8_ = 0;
  auVar827._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar827,auVar345);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar473,auVar827);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar125,auVar594);
  auVar13 = vfmadd231sd_fma(auVar13,auVar125,auVar473);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x38] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar474._8_8_ = 0;
  auVar474._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar2;
  auVar710._8_8_ = 0;
  auVar710._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar710,auVar346,auVar126);
  auVar127._8_8_ = 0;
  auVar127._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar828._8_8_ = 0;
  auVar828._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar828,auVar346);
  auVar13 = vfmadd231sd_fma(auVar13,auVar474,auVar828);
  auVar13 = vfmadd231sd_fma(auVar13,auVar127,auVar595);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar127,auVar474);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x39] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar347._8_8_ = 0;
  auVar347._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar475._8_8_ = 0;
  auVar475._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar596._8_8_ = 0;
  auVar596._0_8_ = dVar2;
  auVar711._8_8_ = 0;
  auVar711._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar711,auVar347,auVar128);
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar829._8_8_ = 0;
  auVar829._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar829,auVar347);
  auVar13 = vfmadd231sd_fma(auVar13,auVar475,auVar829);
  auVar13 = vfmadd231sd_fma(auVar13,auVar129,auVar596);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar129,auVar475);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3a] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar2;
  auVar476._8_8_ = 0;
  auVar476._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar597,auVar476,auVar130);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar712._8_8_ = 0;
  auVar712._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar830._8_8_ = 0;
  auVar830._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar712,auVar830);
  auVar13 = vfmadd231sd_fma(auVar13,auVar712,auVar348);
  auVar13 = vfmadd231sd_fma(auVar13,auVar131,auVar830);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar131,auVar476);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3b] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = dVar2;
  auVar477._8_8_ = 0;
  auVar477._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar598._8_8_ = 0;
  auVar598._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar598,auVar477,auVar132);
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar713._8_8_ = 0;
  auVar713._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar831._8_8_ = 0;
  auVar831._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar713,auVar831);
  auVar13 = vfmadd231sd_fma(auVar13,auVar713,auVar349);
  auVar13 = vfmadd231sd_fma(auVar13,auVar133,auVar831);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar133,auVar477);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar2;
  auVar478._8_8_ = 0;
  auVar478._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar599._8_8_ = 0;
  auVar599._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar599,auVar478,auVar134);
  auVar135._8_8_ = 0;
  auVar135._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar714._8_8_ = 0;
  auVar714._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar832._8_8_ = 0;
  auVar832._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar714,auVar832);
  auVar13 = vfmadd231sd_fma(auVar13,auVar714,auVar350);
  auVar13 = vfmadd231sd_fma(auVar13,auVar135,auVar832);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar135,auVar478);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar351._8_8_ = 0;
  auVar351._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar479._8_8_ = 0;
  auVar479._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar2;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar715,auVar351,auVar136);
  auVar137._8_8_ = 0;
  auVar137._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar833._8_8_ = 0;
  auVar833._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar833,auVar351);
  auVar13 = vfmadd231sd_fma(auVar13,auVar479,auVar833);
  auVar13 = vfmadd231sd_fma(auVar13,auVar137,auVar600);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar137,auVar479);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar352._8_8_ = 0;
  auVar352._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar480._8_8_ = 0;
  auVar480._0_8_ = dVar2;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar601,auVar138,auVar352);
  auVar716._8_8_ = 0;
  auVar716._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar138,auVar716);
  auVar834._8_8_ = 0;
  auVar834._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar913._8_8_ = 0;
  auVar913._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar834,auVar138);
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar934._8_8_ = 0;
  auVar934._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar934,auVar480);
  auVar481._8_8_ = 0;
  auVar481._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar934,auVar481);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar934,auVar913);
  auVar13 = vfmadd231sd_fma(auVar13,auVar934,auVar716);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar139,auVar352);
  auVar13 = vfmadd231sd_fma(auVar13,auVar139,auVar481);
  auVar13 = vfmadd231sd_fma(auVar13,auVar139,auVar913);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar139,auVar834);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x40] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar2;
  auVar482._8_8_ = 0;
  auVar482._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar602,auVar482,auVar140);
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar717._8_8_ = 0;
  auVar717._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar835._8_8_ = 0;
  auVar835._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar717,auVar835);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar717,auVar353);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar141,auVar835);
  auVar13 = vfmadd231sd_fma(auVar13,auVar141,auVar482);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x41] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar354._8_8_ = 0;
  auVar354._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar483._8_8_ = 0;
  auVar483._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar2;
  auVar718._8_8_ = 0;
  auVar718._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar718,auVar354,auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar836._8_8_ = 0;
  auVar836._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar836,auVar354);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar483,auVar836);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar143,auVar603);
  auVar13 = vfmadd231sd_fma(auVar13,auVar143,auVar483);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x42] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar2;
  auVar484._8_8_ = 0;
  auVar484._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar604,auVar484,auVar144);
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar145,auVar484);
  auVar13 = vfmadd231sd_fma(auVar13,auVar355,auVar145);
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar719._8_8_ = 0;
  auVar719._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar146,auVar719);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar355,auVar146);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar837._8_8_ = 0;
  auVar837._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar837,auVar719);
  auVar13 = vfmadd231sd_fma(auVar13,auVar484,auVar837);
  auVar838._8_8_ = 0;
  auVar838._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar838,auVar719);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar838,auVar355);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar147,auVar719);
  auVar13 = vfmadd231sd_fma(auVar13,auVar147,auVar484);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x43] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar356._8_8_ = 0;
  auVar356._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar485._8_8_ = 0;
  auVar485._0_8_ = dVar2;
  auVar605._8_8_ = 0;
  auVar605._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar720._8_8_ = 0;
  auVar720._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar720,auVar356,auVar148);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar149,auVar605);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar485,auVar149);
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar150,auVar356);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar605,auVar150);
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar839._8_8_ = 0;
  auVar839._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar839,auVar356);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar605,auVar839);
  auVar840._8_8_ = 0;
  auVar840._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar840,auVar605);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar485,auVar840);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar151,auVar356);
  auVar13 = vfmadd231sd_fma(auVar13,auVar151,auVar485);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x44] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar357._8_8_ = 0;
  auVar357._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar2;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar606,auVar357,auVar152);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar721._8_8_ = 0;
  auVar721._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar153,auVar721);
  auVar841._8_8_ = 0;
  auVar841._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar914._8_8_ = 0;
  auVar914._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar841,auVar153);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar154,auVar721);
  auVar722._8_8_ = 0;
  auVar722._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar722,auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar935._8_8_ = 0;
  auVar935._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar935,auVar357);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar914,auVar935);
  auVar358._8_8_ = 0;
  auVar358._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar358,auVar914);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar358,auVar486);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar155,auVar722);
  auVar13 = vfmadd231sd_fma(auVar13,auVar155,auVar841);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x45] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dVar2;
  auVar487._8_8_ = 0;
  auVar487._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar607,auVar487,auVar156);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar723._8_8_ = 0;
  auVar723._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar842._8_8_ = 0;
  auVar842._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar723,auVar842);
  auVar13 = vfmadd231sd_fma(auVar13,auVar723,auVar359);
  auVar13 = vfmadd231sd_fma(auVar13,auVar157,auVar842);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar157,auVar487);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x46] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar2;
  auVar488._8_8_ = 0;
  auVar488._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar608._8_8_ = 0;
  auVar608._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar608,auVar488,auVar158);
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar724._8_8_ = 0;
  auVar724._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar159,auVar724);
  auVar13 = vfmadd231sd_fma(auVar13,auVar360,auVar159);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar160,auVar488);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar360,auVar160);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar843._8_8_ = 0;
  auVar843._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar843,auVar724);
  auVar13 = vfmadd231sd_fma(auVar13,auVar843,auVar360);
  auVar361._8_8_ = 0;
  auVar361._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar361,auVar724);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar488,auVar361);
  auVar13 = vfmadd231sd_fma(auVar13,auVar161,auVar724);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar161,auVar488);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x47] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar362._8_8_ = 0;
  auVar362._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar489._8_8_ = 0;
  auVar489._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dVar2;
  auVar725._8_8_ = 0;
  auVar725._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar725,auVar362,auVar162);
  auVar163._8_8_ = 0;
  auVar163._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar163,auVar362);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar489,auVar163);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar164,auVar362);
  auVar13 = vfmadd231sd_fma(auVar13,auVar609,auVar164);
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar844._8_8_ = 0;
  auVar844._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar844,auVar362);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar489,auVar844);
  auVar363._8_8_ = 0;
  auVar363._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar363,auVar609);
  auVar13 = vfmadd231sd_fma(auVar13,auVar489,auVar363);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar165,auVar609);
  auVar13 = vfmadd231sd_fma(auVar13,auVar165,auVar489);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x49] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar364._8_8_ = 0;
  auVar364._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar490._8_8_ = 0;
  auVar490._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar610._8_8_ = 0;
  auVar610._0_8_ = dVar2;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar726,auVar364,auVar166);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar845._8_8_ = 0;
  auVar845._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar845,auVar364);
  auVar13 = vfmadd231sd_fma(auVar13,auVar490,auVar845);
  auVar13 = vfmadd231sd_fma(auVar13,auVar167,auVar610);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar167,auVar490);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4a] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar365._8_8_ = 0;
  auVar365._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x28);
  auVar491._8_8_ = 0;
  auVar491._0_8_ = dVar2;
  auVar611._8_8_ = 0;
  auVar611._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar727._8_8_ = 0;
  auVar727._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar727,auVar365,auVar168);
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar846._8_8_ = 0;
  auVar846._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar169,auVar846);
  auVar915._8_8_ = 0;
  auVar915._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar915,auVar169);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar170,auVar611);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar170,auVar915);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar916._8_8_ = 0;
  auVar916._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar936._8_8_ = 0;
  auVar936._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar916,auVar936);
  auVar13 = vfmadd231sd_fma(auVar13,auVar916,auVar491);
  auVar492._8_8_ = 0;
  auVar492._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar492,auVar365);
  auVar13 = vfmadd231sd_fma(auVar13,auVar492,auVar936);
  auVar13 = vfmadd231sd_fma(auVar13,auVar171,auVar846);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar171,auVar611);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar366._8_8_ = 0;
  auVar366._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar2;
  auVar612._8_8_ = 0;
  auVar612._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar728._8_8_ = 0;
  auVar728._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar728,auVar366,auVar172);
  auVar173._8_8_ = 0;
  auVar173._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar173,auVar366);
  auVar13 = vfmadd231sd_fma(auVar13,auVar612,auVar173);
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar174,auVar612);
  auVar13 = vfmadd231sd_fma(auVar13,auVar493,auVar174);
  auVar175._8_8_ = 0;
  auVar175._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar847._8_8_ = 0;
  auVar847._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar847,auVar612);
  auVar13 = vfmadd231sd_fma(auVar13,auVar493,auVar847);
  auVar848._8_8_ = 0;
  auVar848._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar848,auVar366);
  auVar13 = vfmadd231sd_fma(auVar13,auVar848,auVar612);
  auVar13 = vfmadd231sd_fma(auVar13,auVar175,auVar366);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar175,auVar493);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar367._8_8_ = 0;
  auVar367._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar494._8_8_ = 0;
  auVar494._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar613._8_8_ = 0;
  auVar613._0_8_ = dVar2;
  auVar729._8_8_ = 0;
  auVar729._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar729,auVar367,auVar176);
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar177,auVar367);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar613,auVar177);
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar178,auVar367);
  auVar13 = vfmadd231sd_fma(auVar13,auVar494,auVar178);
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar849._8_8_ = 0;
  auVar849._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar849,auVar613);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar494,auVar849);
  auVar850._8_8_ = 0;
  auVar850._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar850,auVar367);
  auVar13 = vfmadd231sd_fma(auVar13,auVar494,auVar850);
  auVar13 = vfmadd231sd_fma(auVar13,auVar179,auVar613);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar179,auVar494);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar368._8_8_ = 0;
  auVar368._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar2;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar614,auVar180,auVar368);
  auVar730._8_8_ = 0;
  auVar730._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar180,auVar730);
  auVar851._8_8_ = 0;
  auVar851._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar917._8_8_ = 0;
  auVar917._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar851,auVar180);
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar937._8_8_ = 0;
  auVar937._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar937,auVar495);
  auVar496._8_8_ = 0;
  auVar496._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar937,auVar496);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar937,auVar917);
  auVar13 = vfmadd231sd_fma(auVar13,auVar937,auVar730);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar181,auVar368);
  auVar13 = vfmadd231sd_fma(auVar13,auVar181,auVar496);
  auVar13 = vfmadd231sd_fma(auVar13,auVar181,auVar917);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar181,auVar851);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4f] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar2;
  auVar497._8_8_ = 0;
  auVar497._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar615._8_8_ = 0;
  auVar615._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar615,auVar497,auVar182);
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar731._8_8_ = 0;
  auVar731._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar852._8_8_ = 0;
  auVar852._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar731,auVar852);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar731,auVar369);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar183,auVar852);
  auVar13 = vfmadd231sd_fma(auVar13,auVar183,auVar497);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x50] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar370._8_8_ = 0;
  auVar370._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar498._8_8_ = 0;
  auVar498._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  dVar2 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar2;
  auVar732._8_8_ = 0;
  auVar732._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar732,auVar498,auVar184);
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar853._8_8_ = 0;
  auVar853._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar853,auVar616);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar370,auVar853);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar185,auVar498);
  auVar13 = vfmadd231sd_fma(auVar13,auVar185,auVar370);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x51] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar371._8_8_ = 0;
  auVar371._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar499._8_8_ = 0;
  auVar499._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar617._8_8_ = 0;
  auVar617._0_8_ = dVar2;
  auVar733._8_8_ = 0;
  auVar733._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar733,auVar371,auVar186);
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar854._8_8_ = 0;
  auVar854._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar854,auVar371);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar499,auVar854);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar187,auVar617);
  auVar13 = vfmadd231sd_fma(auVar13,auVar187,auVar499);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x52] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar2;
  auVar500._8_8_ = 0;
  auVar500._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar618._8_8_ = 0;
  auVar618._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar618,auVar500,auVar188);
  auVar189._8_8_ = 0;
  auVar189._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar734._8_8_ = 0;
  auVar734._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar855._8_8_ = 0;
  auVar855._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar734,auVar855);
  auVar13 = vfmadd231sd_fma(auVar13,auVar734,auVar372);
  auVar13 = vfmadd231sd_fma(auVar13,auVar189,auVar855);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar189,auVar500);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x53] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar373._8_8_ = 0;
  auVar373._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar2;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = dVar1 * dVar2;
  auVar13 = vfmadd231sd_fma(auVar619,auVar190,auVar373);
  auVar735._8_8_ = 0;
  auVar735._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar190,auVar735);
  auVar856._8_8_ = 0;
  auVar856._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar856,auVar190);
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar918._8_8_ = 0;
  auVar918._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar918,auVar373);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar918,auVar501);
  auVar374._8_8_ = 0;
  auVar374._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar502._8_8_ = 0;
  auVar502._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar918,auVar502);
  auVar13 = vfmadd231sd_fma(auVar13,auVar374,auVar918);
  auVar13 = vfmadd231sd_fma(auVar13,auVar191,auVar735);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar191,auVar502);
  auVar13 = vfmadd231sd_fma(auVar13,auVar191,auVar856);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar191,auVar374);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x54] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar375._8_8_ = 0;
  auVar375._0_8_ = dVar2;
  auVar503._8_8_ = 0;
  auVar503._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar620._8_8_ = 0;
  auVar620._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar620,auVar503,auVar192);
  auVar193._8_8_ = 0;
  auVar193._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar736._8_8_ = 0;
  auVar736._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar857._8_8_ = 0;
  auVar857._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar736,auVar857);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar736,auVar375);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar193,auVar857);
  auVar13 = vfmadd231sd_fma(auVar13,auVar193,auVar503);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x55] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar376._8_8_ = 0;
  auVar376._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar504._8_8_ = 0;
  auVar504._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar621._8_8_ = 0;
  auVar621._0_8_ = dVar2;
  auVar737._8_8_ = 0;
  auVar737._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar737,auVar376,auVar194);
  auVar195._8_8_ = 0;
  auVar195._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar858._8_8_ = 0;
  auVar858._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar858,auVar376);
  auVar13 = vfmadd231sd_fma(auVar13,auVar504,auVar858);
  auVar13 = vfmadd231sd_fma(auVar13,auVar195,auVar621);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar195,auVar504);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x56] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar377._8_8_ = 0;
  auVar377._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar505._8_8_ = 0;
  auVar505._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar622._8_8_ = 0;
  auVar622._0_8_ = dVar2;
  auVar738._8_8_ = 0;
  auVar738._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar738,auVar196,auVar377);
  auVar859._8_8_ = 0;
  auVar859._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar196,auVar859);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar505,auVar196);
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar919._8_8_ = 0;
  auVar919._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar938._8_8_ = 0;
  auVar938._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar919,auVar938);
  auVar948._8_8_ = 0;
  auVar948._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar919,auVar948);
  auVar13 = vfmadd231sd_fma(auVar13,auVar919,auVar622);
  auVar13 = vfmadd231sd_fma(auVar13,auVar919,auVar505);
  auVar13 = vfmadd231sd_fma(auVar13,auVar197,auVar938);
  auVar13 = vfmadd231sd_fma(auVar13,auVar197,auVar948);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar197,auVar377);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar197,auVar859);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x57] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar2;
  auVar506._8_8_ = 0;
  auVar506._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar623._8_8_ = 0;
  auVar623._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar623,auVar506,auVar198);
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar739._8_8_ = 0;
  auVar739._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar860._8_8_ = 0;
  auVar860._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar13 = vfmadd231sd_fma(auVar13,auVar739,auVar860);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar739,auVar378);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar199,auVar860);
  auVar13 = vfmadd231sd_fma(auVar13,auVar199,auVar506);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x59] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar379._8_8_ = 0;
  auVar379._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar507._8_8_ = 0;
  auVar507._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar624._8_8_ = 0;
  auVar624._0_8_ = dVar2;
  auVar740._8_8_ = 0;
  auVar740._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar740,auVar379,auVar200);
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar861._8_8_ = 0;
  auVar861._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar861,auVar379);
  auVar13 = vfmadd231sd_fma(auVar13,auVar507,auVar861);
  auVar13 = vfmadd231sd_fma(auVar13,auVar201,auVar624);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar201,auVar507);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5b] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar508._8_8_ = 0;
  auVar508._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar625._8_8_ = 0;
  auVar625._0_8_ = dVar2;
  auVar741._8_8_ = 0;
  auVar741._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar741,auVar380,auVar202);
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar862._8_8_ = 0;
  auVar862._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar862,auVar380);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar508,auVar862);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar203,auVar625);
  auVar13 = vfmadd231sd_fma(auVar13,auVar203,auVar508);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar2;
  auVar509._8_8_ = 0;
  auVar509._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar626._8_8_ = 0;
  auVar626._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar626,auVar509,auVar204);
  auVar205._8_8_ = 0;
  auVar205._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar742._8_8_ = 0;
  auVar742._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar863._8_8_ = 0;
  auVar863._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar742,auVar863);
  auVar13 = vfmadd231sd_fma(auVar13,auVar742,auVar381);
  auVar13 = vfmadd231sd_fma(auVar13,auVar205,auVar863);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar205,auVar509);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar2;
  auVar510._8_8_ = 0;
  auVar510._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar627,auVar510,auVar206);
  auVar207._8_8_ = 0;
  auVar207._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar743._8_8_ = 0;
  auVar743._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar864._8_8_ = 0;
  auVar864._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar743,auVar864);
  auVar13 = vfmadd231sd_fma(auVar13,auVar743,auVar382);
  auVar13 = vfmadd231sd_fma(auVar13,auVar207,auVar864);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar207,auVar510);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x61] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar383._8_8_ = 0;
  auVar383._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar511._8_8_ = 0;
  auVar511._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar628._8_8_ = 0;
  auVar628._0_8_ = dVar2;
  auVar744._8_8_ = 0;
  auVar744._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar744,auVar208,auVar383);
  auVar865._8_8_ = 0;
  auVar865._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar208,auVar865);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar511,auVar208);
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar920._8_8_ = 0;
  auVar920._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar939._8_8_ = 0;
  auVar939._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar920,auVar939);
  auVar949._8_8_ = 0;
  auVar949._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar920,auVar949);
  auVar13 = vfmadd231sd_fma(auVar13,auVar920,auVar628);
  auVar13 = vfmadd231sd_fma(auVar13,auVar920,auVar511);
  auVar13 = vfmadd231sd_fma(auVar13,auVar209,auVar939);
  auVar13 = vfmadd231sd_fma(auVar13,auVar209,auVar949);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar209,auVar383);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar209,auVar865);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x62] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar2;
  auVar512._8_8_ = 0;
  auVar512._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar629._8_8_ = 0;
  auVar629._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar629,auVar512,auVar210);
  auVar211._8_8_ = 0;
  auVar211._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar745._8_8_ = 0;
  auVar745._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar866._8_8_ = 0;
  auVar866._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar745,auVar866);
  auVar13 = vfmadd231sd_fma(auVar13,auVar745,auVar384);
  auVar13 = vfmadd231sd_fma(auVar13,auVar211,auVar866);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar211,auVar512);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[99] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar385._8_8_ = 0;
  auVar385._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar513._8_8_ = 0;
  auVar513._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar630._8_8_ = 0;
  auVar630._0_8_ = dVar2;
  auVar746._8_8_ = 0;
  auVar746._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar746,auVar385,auVar212);
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar867._8_8_ = 0;
  auVar867._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar867,auVar385);
  auVar13 = vfmadd231sd_fma(auVar13,auVar513,auVar867);
  auVar13 = vfmadd231sd_fma(auVar13,auVar213,auVar630);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar213,auVar513);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[100] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar386._8_8_ = 0;
  auVar386._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar514._8_8_ = 0;
  auVar514._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = dVar2;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar747,auVar386,auVar214);
  auVar215._8_8_ = 0;
  auVar215._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar868._8_8_ = 0;
  auVar868._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar868,auVar386);
  auVar13 = vfmadd231sd_fma(auVar13,auVar514,auVar868);
  auVar13 = vfmadd231sd_fma(auVar13,auVar215,auVar631);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar215,auVar514);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x65] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar387._8_8_ = 0;
  auVar387._0_8_ = dVar2;
  auVar515._8_8_ = 0;
  auVar515._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar632._8_8_ = 0;
  auVar632._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar632,auVar515,auVar216);
  auVar217._8_8_ = 0;
  auVar217._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar217,auVar515);
  auVar13 = vfmadd231sd_fma(auVar13,auVar387,auVar217);
  auVar218._8_8_ = 0;
  auVar218._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar748._8_8_ = 0;
  auVar748._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar218,auVar748);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar387,auVar218);
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar869._8_8_ = 0;
  auVar869._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar869,auVar748);
  auVar13 = vfmadd231sd_fma(auVar13,auVar515,auVar869);
  auVar870._8_8_ = 0;
  auVar870._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar870,auVar748);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar870,auVar387);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar219,auVar748);
  auVar13 = vfmadd231sd_fma(auVar13,auVar219,auVar515);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x67] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar388._8_8_ = 0;
  auVar388._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x28);
  auVar516._8_8_ = 0;
  auVar516._0_8_ = dVar2;
  auVar633._8_8_ = 0;
  auVar633._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar749._8_8_ = 0;
  auVar749._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar749,auVar388,auVar220);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar221,auVar633);
  auVar871._8_8_ = 0;
  auVar871._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar871,auVar221);
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar921._8_8_ = 0;
  auVar921._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar222,auVar921);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar222,auVar633);
  auVar223._8_8_ = 0;
  auVar223._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar634._8_8_ = 0;
  auVar634._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar940._8_8_ = 0;
  auVar940._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar634,auVar940);
  auVar13 = vfmadd231sd_fma(auVar13,auVar634,auVar388);
  auVar389._8_8_ = 0;
  auVar389._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar389,auVar940);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar389,auVar516);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar223,auVar921);
  auVar13 = vfmadd231sd_fma(auVar13,auVar223,auVar871);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x68] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar390._8_8_ = 0;
  auVar390._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar517._8_8_ = 0;
  auVar517._0_8_ = dVar2;
  auVar635._8_8_ = 0;
  auVar635._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar750._8_8_ = 0;
  auVar750._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar750,auVar390,auVar224);
  auVar225._8_8_ = 0;
  auVar225._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar225,auVar635);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar517,auVar225);
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar226,auVar390);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar635,auVar226);
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar872._8_8_ = 0;
  auVar872._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar872,auVar390);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar635,auVar872);
  auVar873._8_8_ = 0;
  auVar873._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar873,auVar635);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar517,auVar873);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar227,auVar390);
  auVar13 = vfmadd231sd_fma(auVar13,auVar227,auVar517);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x69] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar391._8_8_ = 0;
  auVar391._0_8_ = dVar2;
  auVar518._8_8_ = 0;
  auVar518._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar636._8_8_ = 0;
  auVar636._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar636,auVar518,auVar228);
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar751._8_8_ = 0;
  auVar751._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar874._8_8_ = 0;
  auVar874._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar751,auVar874);
  auVar13 = vfmadd231sd_fma(auVar13,auVar751,auVar391);
  auVar13 = vfmadd231sd_fma(auVar13,auVar229,auVar874);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar229,auVar518);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6a] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar392._8_8_ = 0;
  auVar392._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar519._8_8_ = 0;
  auVar519._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar637._8_8_ = 0;
  auVar637._0_8_ = dVar2;
  auVar752._8_8_ = 0;
  auVar752._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar752,auVar519,auVar230);
  auVar231._8_8_ = 0;
  auVar231._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar875._8_8_ = 0;
  auVar875._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar231,auVar875);
  auVar13 = vfmadd231sd_fma(auVar13,auVar392,auVar231);
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar922._8_8_ = 0;
  auVar922._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar232,auVar922);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar232,auVar392);
  auVar233._8_8_ = 0;
  auVar233._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar941._8_8_ = 0;
  auVar941._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar393,auVar941);
  auVar13 = vfmadd231sd_fma(auVar13,auVar393,auVar637);
  auVar394._8_8_ = 0;
  auVar394._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar394,auVar941);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar394,auVar519);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar233,auVar922);
  auVar13 = vfmadd231sd_fma(auVar13,auVar233,auVar875);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6b] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar2;
  auVar520._8_8_ = 0;
  auVar520._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar638,auVar520,auVar234);
  auVar235._8_8_ = 0;
  auVar235._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar235,auVar520);
  auVar13 = vfmadd231sd_fma(auVar13,auVar395,auVar235);
  auVar236._8_8_ = 0;
  auVar236._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar753._8_8_ = 0;
  auVar753._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar236,auVar753);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar395,auVar236);
  auVar237._8_8_ = 0;
  auVar237._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar876._8_8_ = 0;
  auVar876._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar876,auVar753);
  auVar13 = vfmadd231sd_fma(auVar13,auVar520,auVar876);
  auVar877._8_8_ = 0;
  auVar877._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar877,auVar753);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar877,auVar395);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar237,auVar753);
  auVar13 = vfmadd231sd_fma(auVar13,auVar237,auVar520);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6c] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar396._8_8_ = 0;
  auVar396._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar521._8_8_ = 0;
  auVar521._0_8_ = dVar2;
  auVar639._8_8_ = 0;
  auVar639._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar754._8_8_ = 0;
  auVar754._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar754,auVar396,auVar238);
  auVar239._8_8_ = 0;
  auVar239._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar239,auVar639);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar521,auVar239);
  auVar240._8_8_ = 0;
  auVar240._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar240,auVar396);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar639,auVar240);
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar878._8_8_ = 0;
  auVar878._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar878,auVar396);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar639,auVar878);
  auVar879._8_8_ = 0;
  auVar879._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar879,auVar639);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar521,auVar879);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar241,auVar396);
  auVar13 = vfmadd231sd_fma(auVar13,auVar241,auVar521);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar522._8_8_ = 0;
  auVar522._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar640._8_8_ = 0;
  auVar640._0_8_ = dVar2;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar755,auVar242,auVar397);
  auVar880._8_8_ = 0;
  auVar880._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar242,auVar880);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar522,auVar242);
  auVar243._8_8_ = 0;
  auVar243._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar923._8_8_ = 0;
  auVar923._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar942._8_8_ = 0;
  auVar942._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar923,auVar942);
  auVar950._8_8_ = 0;
  auVar950._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar923,auVar950);
  auVar13 = vfmadd231sd_fma(auVar13,auVar923,auVar640);
  auVar13 = vfmadd231sd_fma(auVar13,auVar923,auVar522);
  auVar13 = vfmadd231sd_fma(auVar13,auVar243,auVar942);
  auVar13 = vfmadd231sd_fma(auVar13,auVar243,auVar950);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar243,auVar397);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar243,auVar880);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar2;
  auVar523._8_8_ = 0;
  auVar523._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar641._8_8_ = 0;
  auVar641._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar641,auVar523,auVar244);
  auVar245._8_8_ = 0;
  auVar245._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar756._8_8_ = 0;
  auVar756._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar881._8_8_ = 0;
  auVar881._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar756,auVar881);
  auVar13 = vfmadd231sd_fma(auVar13,auVar756,auVar398);
  auVar13 = vfmadd231sd_fma(auVar13,auVar245,auVar881);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar245,auVar523);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6f] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar2;
  auVar524._8_8_ = 0;
  auVar524._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar642._8_8_ = 0;
  auVar642._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar642,auVar524,auVar246);
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar757._8_8_ = 0;
  auVar757._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar247,auVar757);
  auVar13 = vfmadd231sd_fma(auVar13,auVar399,auVar247);
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar248,auVar524);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar399,auVar248);
  auVar249._8_8_ = 0;
  auVar249._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar882._8_8_ = 0;
  auVar882._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar882,auVar757);
  auVar13 = vfmadd231sd_fma(auVar13,auVar882,auVar399);
  auVar400._8_8_ = 0;
  auVar400._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar400,auVar757);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar524,auVar400);
  auVar13 = vfmadd231sd_fma(auVar13,auVar249,auVar757);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar249,auVar524);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x70] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar401._8_8_ = 0;
  auVar401._0_8_ = dVar2;
  auVar525._8_8_ = 0;
  auVar525._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar643._8_8_ = 0;
  auVar643._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar643,auVar525,auVar250);
  auVar251._8_8_ = 0;
  auVar251._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar758._8_8_ = 0;
  auVar758._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar251,auVar758);
  auVar13 = vfmadd231sd_fma(auVar13,auVar401,auVar251);
  auVar252._8_8_ = 0;
  auVar252._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar252,auVar525);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar401,auVar252);
  auVar253._8_8_ = 0;
  auVar253._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar883._8_8_ = 0;
  auVar883._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar883,auVar758);
  auVar13 = vfmadd231sd_fma(auVar13,auVar883,auVar401);
  auVar402._8_8_ = 0;
  auVar402._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar402,auVar758);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar525,auVar402);
  auVar13 = vfmadd231sd_fma(auVar13,auVar253,auVar758);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar253,auVar525);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x71] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar403._8_8_ = 0;
  auVar403._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar526._8_8_ = 0;
  auVar526._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar644._8_8_ = 0;
  auVar644._0_8_ = dVar2;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar759,auVar403,auVar254);
  auVar255._8_8_ = 0;
  auVar255._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar884._8_8_ = 0;
  auVar884._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar884,auVar403);
  auVar13 = vfmadd231sd_fma(auVar13,auVar526,auVar884);
  auVar13 = vfmadd231sd_fma(auVar13,auVar255,auVar644);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar255,auVar526);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x73] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar404._8_8_ = 0;
  auVar404._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar527._8_8_ = 0;
  auVar527._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar645._8_8_ = 0;
  auVar645._0_8_ = dVar2;
  auVar760._8_8_ = 0;
  auVar760._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar760,auVar404,auVar256);
  auVar257._8_8_ = 0;
  auVar257._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar885._8_8_ = 0;
  auVar885._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar885,auVar404);
  auVar13 = vfmadd231sd_fma(auVar13,auVar527,auVar885);
  auVar13 = vfmadd231sd_fma(auVar13,auVar257,auVar645);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar257,auVar527);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x74] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar405._8_8_ = 0;
  auVar405._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar528._8_8_ = 0;
  auVar528._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar646._8_8_ = 0;
  auVar646._0_8_ = dVar2;
  auVar761._8_8_ = 0;
  auVar761._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar761,auVar405,auVar258);
  auVar259._8_8_ = 0;
  auVar259._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar886._8_8_ = 0;
  auVar886._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar886,auVar405);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar528,auVar886);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar259,auVar646);
  auVar13 = vfmadd231sd_fma(auVar13,auVar259,auVar528);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x76] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar406._8_8_ = 0;
  auVar406._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar529._8_8_ = 0;
  auVar529._0_8_ = dVar2;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar647,auVar260,auVar406);
  auVar762._8_8_ = 0;
  auVar762._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar887._8_8_ = 0;
  auVar887._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar260,auVar887);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar762,auVar260);
  auVar261._8_8_ = 0;
  auVar261._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar924._8_8_ = 0;
  auVar924._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar943._8_8_ = 0;
  auVar943._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar924,auVar943);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar924,auVar529);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar924,auVar887);
  auVar530._8_8_ = 0;
  auVar530._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar530,auVar924);
  auVar13 = vfmadd231sd_fma(auVar13,auVar261,auVar406);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar261,auVar943);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar261,auVar530);
  auVar13 = vfmadd231sd_fma(auVar13,auVar261,auVar762);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x77] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar407._8_8_ = 0;
  auVar407._0_8_ = dVar2;
  auVar531._8_8_ = 0;
  auVar531._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar648._8_8_ = 0;
  auVar648._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar648,auVar531,auVar262);
  auVar263._8_8_ = 0;
  auVar263._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar763._8_8_ = 0;
  auVar763._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar888._8_8_ = 0;
  auVar888._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar763,auVar888);
  auVar13 = vfmadd231sd_fma(auVar13,auVar763,auVar407);
  auVar13 = vfmadd231sd_fma(auVar13,auVar263,auVar888);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar263,auVar531);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x78] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar2;
  auVar532._8_8_ = 0;
  auVar532._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar649._8_8_ = 0;
  auVar649._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar649,auVar532,auVar264);
  auVar265._8_8_ = 0;
  auVar265._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar764._8_8_ = 0;
  auVar764._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar889._8_8_ = 0;
  auVar889._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar13 = vfmadd231sd_fma(auVar13,auVar764,auVar889);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar764,auVar408);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar265,auVar889);
  auVar13 = vfmadd231sd_fma(auVar13,auVar265,auVar532);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x79] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar409._8_8_ = 0;
  auVar409._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar533._8_8_ = 0;
  auVar533._0_8_ = dVar2;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar650,auVar266,auVar409);
  auVar765._8_8_ = 0;
  auVar765._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar266,auVar765);
  auVar890._8_8_ = 0;
  auVar890._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar925._8_8_ = 0;
  auVar925._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar890,auVar266);
  auVar267._8_8_ = 0;
  auVar267._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar944._8_8_ = 0;
  auVar944._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar944,auVar533);
  auVar534._8_8_ = 0;
  auVar534._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar944,auVar534);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar944,auVar925);
  auVar13 = vfmadd231sd_fma(auVar13,auVar944,auVar765);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar267,auVar409);
  auVar13 = vfmadd231sd_fma(auVar13,auVar267,auVar534);
  auVar13 = vfmadd231sd_fma(auVar13,auVar267,auVar925);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar267,auVar890);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7a] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar410._8_8_ = 0;
  auVar410._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar535._8_8_ = 0;
  auVar535._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = dVar2;
  auVar766._8_8_ = 0;
  auVar766._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar766,auVar410,auVar268);
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar891._8_8_ = 0;
  auVar891._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar891,auVar410);
  auVar13 = vfmadd231sd_fma(auVar13,auVar535,auVar891);
  auVar13 = vfmadd231sd_fma(auVar13,auVar269,auVar651);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar269,auVar535);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7b] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar411._8_8_ = 0;
  auVar411._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar536._8_8_ = 0;
  auVar536._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar652._8_8_ = 0;
  auVar652._0_8_ = dVar2;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = dVar2 * dVar1;
  auVar13 = vfnmsub231sd_fma(auVar767,auVar270,auVar411);
  auVar892._8_8_ = 0;
  auVar892._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfmadd231sd_fma(auVar13,auVar270,auVar892);
  auVar13 = vfmadd231sd_fma(auVar13,auVar536,auVar270);
  auVar271._8_8_ = 0;
  auVar271._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar926._8_8_ = 0;
  auVar926._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar945._8_8_ = 0;
  auVar945._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar926,auVar945);
  auVar951._8_8_ = 0;
  auVar951._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfmadd231sd_fma(auVar13,auVar926,auVar951);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar926,auVar892);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar926,auVar536);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar271,auVar945);
  auVar13 = vfmadd231sd_fma(auVar13,auVar271,auVar411);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar271,auVar951);
  auVar13 = vfmadd231sd_fma(auVar13,auVar271,auVar652);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7d] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar412._8_8_ = 0;
  auVar412._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar537._8_8_ = 0;
  auVar537._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = dVar2;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar768,auVar412,auVar272);
  auVar273._8_8_ = 0;
  auVar273._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar893._8_8_ = 0;
  auVar893._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar893,auVar412);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar537,auVar893);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar273,auVar653);
  auVar13 = vfmadd231sd_fma(auVar13,auVar273,auVar537);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7e] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar413._8_8_ = 0;
  auVar413._0_8_ = dVar2;
  auVar538._8_8_ = 0;
  auVar538._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar654._8_8_ = 0;
  auVar654._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar654,auVar538,auVar274);
  auVar275._8_8_ = 0;
  auVar275._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar769._8_8_ = 0;
  auVar769._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar894._8_8_ = 0;
  auVar894._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfnmadd231sd_fma(auVar13,auVar769,auVar894);
  auVar13 = vfmadd231sd_fma(auVar13,auVar769,auVar413);
  auVar13 = vfmadd231sd_fma(auVar13,auVar275,auVar894);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar275,auVar538);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7f] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar414._8_8_ = 0;
  auVar414._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar539._8_8_ = 0;
  auVar539._0_8_ = dVar2;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar655,auVar276,auVar414);
  auVar770._8_8_ = 0;
  auVar770._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar276,auVar770);
  auVar895._8_8_ = 0;
  auVar895._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar927._8_8_ = 0;
  auVar927._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar927,auVar276);
  auVar277._8_8_ = 0;
  auVar277._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar946._8_8_ = 0;
  auVar946._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar946,auVar414);
  auVar13 = vfmadd231sd_fma(auVar13,auVar946,auVar770);
  auVar415._8_8_ = 0;
  auVar415._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar946,auVar415);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar895,auVar946);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar277,auVar539);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar277,auVar927);
  auVar13 = vfmadd231sd_fma(auVar13,auVar277,auVar415);
  auVar13 = vfmadd231sd_fma(auVar13,auVar277,auVar895);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x80] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar416._8_8_ = 0;
  auVar416._0_8_ = dVar2;
  auVar540._8_8_ = 0;
  auVar540._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar656,auVar540,auVar278);
  auVar279._8_8_ = 0;
  auVar279._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar771._8_8_ = 0;
  auVar771._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar896._8_8_ = 0;
  auVar896._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar13 = vfmadd231sd_fma(auVar13,auVar771,auVar896);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar771,auVar416);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar279,auVar896);
  auVar13 = vfmadd231sd_fma(auVar13,auVar279,auVar540);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x81] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar417._8_8_ = 0;
  auVar417._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar541._8_8_ = 0;
  auVar541._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar657._8_8_ = 0;
  auVar657._0_8_ = dVar2;
  auVar772._8_8_ = 0;
  auVar772._0_8_ = dVar2 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar772,auVar417,auVar280);
  auVar281._8_8_ = 0;
  auVar281._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar897._8_8_ = 0;
  auVar897._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar897,auVar417);
  auVar13 = vfmadd231sd_fma(auVar13,auVar541,auVar897);
  auVar13 = vfmadd231sd_fma(auVar13,auVar281,auVar657);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar281,auVar541);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x82] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar418._8_8_ = 0;
  auVar418._0_8_ = dVar2;
  auVar542._8_8_ = 0;
  auVar542._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar658._8_8_ = 0;
  auVar658._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar658,auVar542,auVar282);
  auVar283._8_8_ = 0;
  auVar283._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar773._8_8_ = 0;
  auVar773._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar898._8_8_ = 0;
  auVar898._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar773,auVar898);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar773,auVar418);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar283,auVar898);
  auVar13 = vfmadd231sd_fma(auVar13,auVar283,auVar542);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x85] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar2;
  auVar543._8_8_ = 0;
  auVar543._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar659._8_8_ = 0;
  auVar659._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar659,auVar543,auVar284);
  auVar285._8_8_ = 0;
  auVar285._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar774._8_8_ = 0;
  auVar774._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar899._8_8_ = 0;
  auVar899._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar13 = vfmadd231sd_fma(auVar13,auVar774,auVar899);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar774,auVar419);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar285,auVar899);
  auVar13 = vfmadd231sd_fma(auVar13,auVar285,auVar543);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x86] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar420._8_8_ = 0;
  auVar420._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar544._8_8_ = 0;
  auVar544._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar660._8_8_ = 0;
  auVar660._0_8_ = dVar2;
  auVar775._8_8_ = 0;
  auVar775._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar775,auVar420,auVar286);
  auVar287._8_8_ = 0;
  auVar287._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar900._8_8_ = 0;
  auVar900._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar900,auVar420);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar544,auVar900);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar287,auVar660);
  auVar13 = vfmadd231sd_fma(auVar13,auVar287,auVar544);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x88] = auVar13._0_8_;
  pMVar11 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar1;
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar421._8_8_ = 0;
  auVar421._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar545._8_8_ = 0;
  auVar545._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar661._8_8_ = 0;
  auVar661._0_8_ = dVar2;
  auVar776._8_8_ = 0;
  auVar776._0_8_ = dVar1 * dVar2;
  auVar13 = vfnmadd231sd_fma(auVar776,auVar421,auVar288);
  auVar289._8_8_ = 0;
  auVar289._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar901._8_8_ = 0;
  auVar901._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar13,auVar901,auVar421);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar545,auVar901);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar289,auVar661);
  auVar13 = vfmadd231sd_fma(auVar13,auVar289,auVar545);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x89] = auVar13._0_8_;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double,1,197>
opengv::relative_pose::modules::fivept_kneip::initEpncpRowR(
    std::vector<Eigen::Matrix3d,Eigen::aligned_allocator<Eigen::Matrix3d> > & c123_1,
    std::vector<Eigen::Matrix3d,Eigen::aligned_allocator<Eigen::Matrix3d> > & c123_2 )
{
  Eigen::Matrix<double,1,197> row = Eigen::Matrix<double,1,197>::Zero();
  row(0,0) = -c123_1[1](0,0)*c123_2[2](1,2)+c123_1[1](0,0)*c123_2[2](2,1)+c123_1[0](0,1)*c123_2[2](1,2)-c123_1[0](0,1)*c123_2[1](2,2)-c123_1[0](1,0)*c123_2[2](2,1)+c123_1[0](1,0)*c123_2[1](2,2);
  row(0,1) = -c123_1[1](0,0)*c123_2[1](1,2)+c123_1[1](0,0)*c123_2[1](2,1)+c123_1[0](0,1)*c123_2[2](1,1)-c123_1[0](0,1)*c123_2[1](2,1)-c123_1[0](1,0)*c123_2[2](1,1)+c123_1[0](1,0)*c123_2[1](1,2);
  row(0,2) = -c123_1[1](0,0)*c123_2[2](0,2)+c123_1[1](0,0)*c123_2[2](2,0)+c123_1[0](0,1)*c123_2[2](0,2)-c123_1[0](0,1)*c123_2[0](2,2)-c123_1[0](1,0)*c123_2[2](2,0)+c123_1[0](1,0)*c123_2[0](2,2);
  row(0,3) = -c123_1[1](0,0)*c123_2[1](0,2)-c123_1[1](0,0)*c123_2[0](1,2)+c123_1[1](0,0)*c123_2[1](2,0)+c123_1[1](0,0)*c123_2[0](2,1)+c123_1[0](0,1)*c123_2[2](0,1)+c123_1[0](0,1)*c123_2[2](1,0)-c123_1[0](0,1)*c123_2[1](2,0)-c123_1[0](0,1)*c123_2[0](2,1)-c123_1[0](1,0)*c123_2[2](0,1)+c123_1[0](1,0)*c123_2[1](0,2)-c123_1[0](1,0)*c123_2[2](1,0)+c123_1[0](1,0)*c123_2[0](1,2);
  row(0,4) = -c123_1[1](0,0)*c123_2[0](0,2)+c123_1[1](0,0)*c123_2[0](2,0)+c123_1[0](0,1)*c123_2[2](0,0)-c123_1[0](0,1)*c123_2[0](2,0)-c123_1[0](1,0)*c123_2[2](0,0)+c123_1[0](1,0)*c123_2[0](0,2);
  row(0,5) = c123_1[2](0,0)*c123_2[2](1,2)-c123_1[2](0,0)*c123_2[2](2,1)-c123_1[0](0,2)*c123_2[2](1,2)+c123_1[0](0,2)*c123_2[1](2,2)+c123_1[0](2,0)*c123_2[2](2,1)-c123_1[0](2,0)*c123_2[1](2,2);
  row(0,6) = c123_1[2](0,0)*c123_2[2](0,2)-c123_1[2](0,0)*c123_2[2](2,0)-c123_1[0](0,2)*c123_2[2](0,2)+c123_1[0](0,2)*c123_2[0](2,2)+c123_1[0](2,0)*c123_2[2](2,0)-c123_1[0](2,0)*c123_2[0](2,2);
  row(0,7) = c123_1[1](0,0)*c123_2[2](1,2)-c123_1[1](0,0)*c123_2[2](2,1)-c123_1[0](0,1)*c123_2[2](1,2)+c123_1[0](0,1)*c123_2[1](2,2)+c123_1[0](1,0)*c123_2[2](2,1)-c123_1[0](1,0)*c123_2[1](2,2);
  row(0,8) = c123_1[1](0,0)*c123_2[1](1,2)-c123_1[1](0,0)*c123_2[1](2,1)-c123_1[0](0,1)*c123_2[2](1,1)+c123_1[0](0,1)*c123_2[1](2,1)+c123_1[0](1,0)*c123_2[2](1,1)-c123_1[0](1,0)*c123_2[1](1,2);
  row(0,10) = -c123_1[1](0,0)*c123_2[2](0,1)+c123_1[1](0,0)*c123_2[2](1,0)+c123_1[1](0,0)*c123_2[0](1,2)-c123_1[1](0,0)*c123_2[0](2,1)+c123_1[0](0,1)*c123_2[1](0,2)-c123_1[0](0,1)*c123_2[2](1,0)-c123_1[0](0,1)*c123_2[0](1,2)+c123_1[0](0,1)*c123_2[1](2,0)+c123_1[0](1,0)*c123_2[2](0,1)-c123_1[0](1,0)*c123_2[1](0,2)-c123_1[0](1,0)*c123_2[1](2,0)+c123_1[0](1,0)*c123_2[0](2,1);
  row(0,11) = -c123_1[1](0,0)*c123_2[1](0,1)+c123_1[1](0,0)*c123_2[1](1,0)+c123_1[0](0,1)*c123_2[1](0,1)-c123_1[0](0,1)*c123_2[0](1,1)-c123_1[0](1,0)*c123_2[1](1,0)+c123_1[0](1,0)*c123_2[0](1,1);
  row(0,12) = -c123_1[1](0,0)*c123_2[0](0,1)+c123_1[1](0,0)*c123_2[0](1,0)+c123_1[0](0,1)*c123_2[1](0,0)-c123_1[0](0,1)*c123_2[0](1,0)-c123_1[0](1,0)*c123_2[1](0,0)+c123_1[0](1,0)*c123_2[0](0,1);
  row(0,13) = -c123_1[2](0,0)*c123_2[2](1,2)+c123_1[2](0,0)*c123_2[2](2,1)+c123_1[0](0,2)*c123_2[2](1,2)-c123_1[0](0,2)*c123_2[1](2,2)-c123_1[0](2,0)*c123_2[2](2,1)+c123_1[0](2,0)*c123_2[1](2,2);
  row(0,14) = c123_1[2](0,0)*c123_2[1](1,2)-c123_1[2](0,0)*c123_2[1](2,1)-c123_1[0](0,2)*c123_2[2](1,1)+c123_1[0](0,2)*c123_2[1](2,1)+c123_1[0](2,0)*c123_2[2](1,1)-c123_1[0](2,0)*c123_2[1](1,2);
  row(0,15) = c123_1[2](0,0)*c123_2[2](0,1)+c123_1[2](0,0)*c123_2[1](0,2)-c123_1[2](0,0)*c123_2[2](1,0)-c123_1[2](0,0)*c123_2[1](2,0)-c123_1[0](0,2)*c123_2[2](0,1)-c123_1[0](0,2)*c123_2[1](0,2)+c123_1[0](0,2)*c123_2[0](1,2)+c123_1[0](0,2)*c123_2[0](2,1)+c123_1[0](2,0)*c123_2[2](1,0)-c123_1[0](2,0)*c123_2[0](1,2)+c123_1[0](2,0)*c123_2[1](2,0)-c123_1[0](2,0)*c123_2[0](2,1);
  row(0,16) = -c123_1[2](0,0)*c123_2[1](1,2)+c123_1[2](0,0)*c123_2[1](2,1)+c123_1[0](0,2)*c123_2[2](1,1)-c123_1[0](0,2)*c123_2[1](2,1)-c123_1[0](2,0)*c123_2[2](1,1)+c123_1[0](2,0)*c123_2[1](1,2);
  row(0,18) = c123_1[2](0,0)*c123_2[1](0,1)-c123_1[2](0,0)*c123_2[1](1,0)-c123_1[0](0,2)*c123_2[1](0,1)+c123_1[0](0,2)*c123_2[0](1,1)+c123_1[0](2,0)*c123_2[1](1,0)-c123_1[0](2,0)*c123_2[0](1,1);
  row(0,19) = c123_1[1](0,0)*c123_2[2](0,2)-c123_1[1](0,0)*c123_2[2](2,0)-c123_1[0](0,1)*c123_2[2](0,2)+c123_1[0](0,1)*c123_2[0](2,2)+c123_1[0](1,0)*c123_2[2](2,0)-c123_1[0](1,0)*c123_2[0](2,2);
  row(0,20) = c123_1[1](0,0)*c123_2[2](0,1)+c123_1[1](0,0)*c123_2[1](0,2)-c123_1[1](0,0)*c123_2[2](1,0)-c123_1[1](0,0)*c123_2[1](2,0)-c123_1[0](0,1)*c123_2[2](0,1)-c123_1[0](0,1)*c123_2[1](0,2)+c123_1[0](0,1)*c123_2[0](1,2)+c123_1[0](0,1)*c123_2[0](2,1)+c123_1[0](1,0)*c123_2[2](1,0)-c123_1[0](1,0)*c123_2[0](1,2)+c123_1[0](1,0)*c123_2[1](2,0)-c123_1[0](1,0)*c123_2[0](2,1);
  row(0,21) = c123_1[1](0,0)*c123_2[1](0,1)-c123_1[1](0,0)*c123_2[1](1,0)-c123_1[0](0,1)*c123_2[1](0,1)+c123_1[0](0,1)*c123_2[0](1,1)+c123_1[0](1,0)*c123_2[1](1,0)-c123_1[0](1,0)*c123_2[0](1,1);
  row(0,22) = c123_1[1](0,0)*c123_2[0](0,2)-c123_1[1](0,0)*c123_2[0](2,0)-c123_1[0](0,1)*c123_2[2](0,0)+c123_1[0](0,1)*c123_2[0](2,0)+c123_1[0](1,0)*c123_2[2](0,0)-c123_1[0](1,0)*c123_2[0](0,2);
  row(0,23) = c123_1[1](0,0)*c123_2[0](0,1)-c123_1[1](0,0)*c123_2[0](1,0)-c123_1[0](0,1)*c123_2[1](0,0)+c123_1[0](0,1)*c123_2[0](1,0)+c123_1[0](1,0)*c123_2[1](0,0)-c123_1[0](1,0)*c123_2[0](0,1);
  row(0,25) = -c123_1[2](0,0)*c123_2[2](0,2)+c123_1[2](0,0)*c123_2[2](2,0)+c123_1[0](0,2)*c123_2[2](0,2)-c123_1[0](0,2)*c123_2[0](2,2)-c123_1[0](2,0)*c123_2[2](2,0)+c123_1[0](2,0)*c123_2[0](2,2);
  row(0,26) = -c123_1[2](0,0)*c123_2[2](0,1)+c123_1[2](0,0)*c123_2[2](1,0)+c123_1[2](0,0)*c123_2[0](1,2)-c123_1[2](0,0)*c123_2[0](2,1)+c123_1[0](0,2)*c123_2[1](0,2)-c123_1[0](0,2)*c123_2[2](1,0)-c123_1[0](0,2)*c123_2[0](1,2)+c123_1[0](0,2)*c123_2[1](2,0)+c123_1[0](2,0)*c123_2[2](0,1)-c123_1[0](2,0)*c123_2[1](0,2)-c123_1[0](2,0)*c123_2[1](2,0)+c123_1[0](2,0)*c123_2[0](2,1);
  row(0,27) = c123_1[2](0,0)*c123_2[0](0,2)-c123_1[2](0,0)*c123_2[0](2,0)-c123_1[0](0,2)*c123_2[2](0,0)+c123_1[0](0,2)*c123_2[0](2,0)+c123_1[0](2,0)*c123_2[2](0,0)-c123_1[0](2,0)*c123_2[0](0,2);
  row(0,28) = -c123_1[2](0,0)*c123_2[1](0,2)-c123_1[2](0,0)*c123_2[0](1,2)+c123_1[2](0,0)*c123_2[1](2,0)+c123_1[2](0,0)*c123_2[0](2,1)+c123_1[0](0,2)*c123_2[2](0,1)+c123_1[0](0,2)*c123_2[2](1,0)-c123_1[0](0,2)*c123_2[1](2,0)-c123_1[0](0,2)*c123_2[0](2,1)-c123_1[0](2,0)*c123_2[2](0,1)+c123_1[0](2,0)*c123_2[1](0,2)-c123_1[0](2,0)*c123_2[2](1,0)+c123_1[0](2,0)*c123_2[0](1,2);
  row(0,29) = -c123_1[2](0,0)*c123_2[1](0,1)+c123_1[2](0,0)*c123_2[1](1,0)+c123_1[0](0,2)*c123_2[1](0,1)-c123_1[0](0,2)*c123_2[0](1,1)-c123_1[0](2,0)*c123_2[1](1,0)+c123_1[0](2,0)*c123_2[0](1,1);
  row(0,30) = c123_1[2](0,0)*c123_2[0](0,1)-c123_1[2](0,0)*c123_2[0](1,0)-c123_1[0](0,2)*c123_2[1](0,0)+c123_1[0](0,2)*c123_2[0](1,0)+c123_1[0](2,0)*c123_2[1](0,0)-c123_1[0](2,0)*c123_2[0](0,1);
  row(0,33) = -c123_1[2](0,0)*c123_2[0](0,2)+c123_1[2](0,0)*c123_2[0](2,0)+c123_1[0](0,2)*c123_2[2](0,0)-c123_1[0](0,2)*c123_2[0](2,0)-c123_1[0](2,0)*c123_2[2](0,0)+c123_1[0](2,0)*c123_2[0](0,2);
  row(0,34) = -c123_1[2](0,0)*c123_2[0](0,1)+c123_1[2](0,0)*c123_2[0](1,0)+c123_1[0](0,2)*c123_2[1](0,0)-c123_1[0](0,2)*c123_2[0](1,0)-c123_1[0](2,0)*c123_2[1](0,0)+c123_1[0](2,0)*c123_2[0](0,1);
  row(0,39) = -c123_1[1](0,1)*c123_2[2](2,1)+c123_1[1](0,1)*c123_2[1](2,2)+c123_1[1](1,0)*c123_2[2](1,2)-c123_1[1](1,0)*c123_2[1](2,2)-c123_1[0](1,1)*c123_2[2](1,2)+c123_1[0](1,1)*c123_2[2](2,1);
  row(0,40) = -c123_1[1](0,1)*c123_2[2](1,1)+c123_1[1](0,1)*c123_2[1](1,2)+c123_1[1](1,0)*c123_2[2](1,1)-c123_1[1](1,0)*c123_2[1](2,1)-c123_1[0](1,1)*c123_2[1](1,2)+c123_1[0](1,1)*c123_2[1](2,1);
  row(0,41) = -c123_1[1](0,1)*c123_2[2](2,0)+c123_1[1](0,1)*c123_2[0](2,2)+c123_1[1](1,0)*c123_2[2](0,2)-c123_1[1](1,0)*c123_2[0](2,2)-c123_1[0](1,1)*c123_2[2](0,2)+c123_1[0](1,1)*c123_2[2](2,0);
  row(0,42) = -c123_1[1](0,1)*c123_2[2](0,1)+c123_1[1](0,1)*c123_2[1](0,2)-c123_1[1](0,1)*c123_2[2](1,0)+c123_1[1](0,1)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[2](0,1)+c123_1[1](1,0)*c123_2[2](1,0)-c123_1[1](1,0)*c123_2[1](2,0)-c123_1[1](1,0)*c123_2[0](2,1)-c123_1[0](1,1)*c123_2[1](0,2)-c123_1[0](1,1)*c123_2[0](1,2)+c123_1[0](1,1)*c123_2[1](2,0)+c123_1[0](1,1)*c123_2[0](2,1);
  row(0,43) = -c123_1[1](0,1)*c123_2[2](0,0)+c123_1[1](0,1)*c123_2[0](0,2)+c123_1[1](1,0)*c123_2[2](0,0)-c123_1[1](1,0)*c123_2[0](2,0)-c123_1[0](1,1)*c123_2[0](0,2)+c123_1[0](1,1)*c123_2[0](2,0);
  row(0,44) = -c123_1[2](0,1)*c123_2[2](1,2)+c123_1[2](0,1)*c123_2[2](2,1)+c123_1[1](0,2)*c123_2[2](1,2)-c123_1[1](0,2)*c123_2[1](2,2)-c123_1[2](1,0)*c123_2[2](1,2)+c123_1[2](1,0)*c123_2[2](2,1)+c123_1[0](1,2)*c123_2[2](1,2)-c123_1[0](1,2)*c123_2[1](2,2)-c123_1[1](2,0)*c123_2[2](2,1)+c123_1[1](2,0)*c123_2[1](2,2)-c123_1[0](2,1)*c123_2[2](2,1)+c123_1[0](2,1)*c123_2[1](2,2);
  row(0,45) = -c123_1[2](0,1)*c123_2[2](0,2)+c123_1[2](0,1)*c123_2[2](2,0)+c123_1[1](0,2)*c123_2[2](0,2)-c123_1[1](0,2)*c123_2[0](2,2)-c123_1[2](1,0)*c123_2[2](0,2)+c123_1[2](1,0)*c123_2[2](2,0)+c123_1[0](1,2)*c123_2[2](0,2)-c123_1[0](1,2)*c123_2[0](2,2)-c123_1[1](2,0)*c123_2[2](2,0)+c123_1[1](2,0)*c123_2[0](2,2)-c123_1[0](2,1)*c123_2[2](2,0)+c123_1[0](2,1)*c123_2[0](2,2);
  row(0,46) = c123_1[2](0,1)*c123_2[2](1,2)-c123_1[2](0,1)*c123_2[1](2,2)-c123_1[1](0,2)*c123_2[2](1,2)+c123_1[1](0,2)*c123_2[2](2,1)-c123_1[2](1,0)*c123_2[2](2,1)+c123_1[2](1,0)*c123_2[1](2,2)-c123_1[0](1,2)*c123_2[2](2,1)+c123_1[0](1,2)*c123_2[1](2,2)-c123_1[1](2,0)*c123_2[2](1,2)+c123_1[1](2,0)*c123_2[2](2,1)+c123_1[0](2,1)*c123_2[2](1,2)-c123_1[0](2,1)*c123_2[1](2,2);
  row(0,47) = c123_1[2](0,1)*c123_2[2](1,1)-c123_1[2](0,1)*c123_2[1](1,2)+c123_1[1](0,2)*c123_2[2](1,1)-c123_1[1](0,2)*c123_2[1](1,2)-c123_1[2](1,0)*c123_2[2](1,1)+c123_1[2](1,0)*c123_2[1](2,1)+c123_1[0](1,2)*c123_2[1](1,2)-c123_1[0](1,2)*c123_2[1](2,1)-c123_1[1](2,0)*c123_2[2](1,1)+c123_1[1](2,0)*c123_2[1](2,1)+c123_1[0](2,1)*c123_2[1](1,2)-c123_1[0](2,1)*c123_2[1](2,1);
  row(0,48) = -c123_1[2](0,1)*c123_2[1](0,2)+c123_1[2](0,1)*c123_2[2](1,0)+c123_1[1](0,2)*c123_2[2](0,1)-c123_1[1](0,2)*c123_2[0](1,2)-c123_1[2](1,0)*c123_2[2](0,1)+c123_1[2](1,0)*c123_2[1](2,0)+c123_1[0](1,2)*c123_2[1](0,2)-c123_1[0](1,2)*c123_2[0](2,1)-c123_1[1](2,0)*c123_2[2](1,0)+c123_1[1](2,0)*c123_2[0](2,1)+c123_1[0](2,1)*c123_2[0](1,2)-c123_1[0](2,1)*c123_2[1](2,0);
  row(0,49) = -c123_1[2](0,2)*c123_2[2](2,1)+c123_1[2](0,2)*c123_2[1](2,2)+c123_1[2](2,0)*c123_2[2](1,2)-c123_1[2](2,0)*c123_2[1](2,2)-c123_1[0](2,2)*c123_2[2](1,2)+c123_1[0](2,2)*c123_2[2](2,1);
  row(0,50) = -c123_1[2](0,2)*c123_2[2](1,1)+c123_1[2](0,2)*c123_2[1](1,2)+c123_1[2](2,0)*c123_2[2](1,1)-c123_1[2](2,0)*c123_2[1](2,1)-c123_1[0](2,2)*c123_2[1](1,2)+c123_1[0](2,2)*c123_2[1](2,1);
  row(0,51) = c123_1[2](0,1)*c123_2[2](0,2)-c123_1[2](0,1)*c123_2[0](2,2)-c123_1[1](0,2)*c123_2[2](0,2)+c123_1[1](0,2)*c123_2[2](2,0)-c123_1[2](1,0)*c123_2[2](2,0)+c123_1[2](1,0)*c123_2[0](2,2)-c123_1[0](1,2)*c123_2[2](2,0)+c123_1[0](1,2)*c123_2[0](2,2)-c123_1[1](2,0)*c123_2[2](0,2)+c123_1[1](2,0)*c123_2[2](2,0)+c123_1[0](2,1)*c123_2[2](0,2)-c123_1[0](2,1)*c123_2[0](2,2);
  row(0,52) = c123_1[2](0,1)*c123_2[2](0,1)-c123_1[2](0,1)*c123_2[0](1,2)-c123_1[1](0,2)*c123_2[1](0,2)+c123_1[1](0,2)*c123_2[2](1,0)-c123_1[2](1,0)*c123_2[2](1,0)+c123_1[2](1,0)*c123_2[0](2,1)+c123_1[0](1,2)*c123_2[0](1,2)-c123_1[0](1,2)*c123_2[1](2,0)-c123_1[1](2,0)*c123_2[2](0,1)+c123_1[1](2,0)*c123_2[1](2,0)+c123_1[0](2,1)*c123_2[1](0,2)-c123_1[0](2,1)*c123_2[0](2,1);
  row(0,53) = c123_1[2](0,1)*c123_2[2](0,0)-c123_1[2](0,1)*c123_2[0](0,2)+c123_1[1](0,2)*c123_2[2](0,0)-c123_1[1](0,2)*c123_2[0](0,2)-c123_1[2](1,0)*c123_2[2](0,0)+c123_1[2](1,0)*c123_2[0](2,0)+c123_1[0](1,2)*c123_2[0](0,2)-c123_1[0](1,2)*c123_2[0](2,0)-c123_1[1](2,0)*c123_2[2](0,0)+c123_1[1](2,0)*c123_2[0](2,0)+c123_1[0](2,1)*c123_2[0](0,2)-c123_1[0](2,1)*c123_2[0](2,0);
  row(0,54) = -c123_1[2](0,2)*c123_2[2](2,0)+c123_1[2](0,2)*c123_2[0](2,2)+c123_1[2](2,0)*c123_2[2](0,2)-c123_1[2](2,0)*c123_2[0](2,2)-c123_1[0](2,2)*c123_2[2](0,2)+c123_1[0](2,2)*c123_2[2](2,0);
  row(0,55) = -c123_1[2](0,2)*c123_2[2](0,1)+c123_1[2](0,2)*c123_2[1](0,2)-c123_1[2](0,2)*c123_2[2](1,0)+c123_1[2](0,2)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[2](0,1)+c123_1[2](2,0)*c123_2[2](1,0)-c123_1[2](2,0)*c123_2[1](2,0)-c123_1[2](2,0)*c123_2[0](2,1)-c123_1[0](2,2)*c123_2[1](0,2)-c123_1[0](2,2)*c123_2[0](1,2)+c123_1[0](2,2)*c123_2[1](2,0)+c123_1[0](2,2)*c123_2[0](2,1);
  row(0,56) = -c123_1[2](0,2)*c123_2[2](0,0)+c123_1[2](0,2)*c123_2[0](0,2)+c123_1[2](2,0)*c123_2[2](0,0)-c123_1[2](2,0)*c123_2[0](2,0)-c123_1[0](2,2)*c123_2[0](0,2)+c123_1[0](2,2)*c123_2[0](2,0);
  row(0,57) = c123_1[2](1,1)*c123_2[2](1,2)-c123_1[2](1,1)*c123_2[2](2,1)-c123_1[1](1,2)*c123_2[2](1,2)+c123_1[1](1,2)*c123_2[1](2,2)+c123_1[1](2,1)*c123_2[2](2,1)-c123_1[1](2,1)*c123_2[1](2,2);
  row(0,58) = c123_1[2](1,1)*c123_2[2](0,2)-c123_1[2](1,1)*c123_2[2](2,0)-c123_1[1](1,2)*c123_2[2](0,2)+c123_1[1](1,2)*c123_2[0](2,2)+c123_1[1](2,1)*c123_2[2](2,0)-c123_1[1](2,1)*c123_2[0](2,2);
  row(0,59) = c123_1[2](1,2)*c123_2[2](2,1)-c123_1[2](1,2)*c123_2[1](2,2)-c123_1[2](2,1)*c123_2[2](1,2)+c123_1[2](2,1)*c123_2[1](2,2)+c123_1[1](2,2)*c123_2[2](1,2)-c123_1[1](2,2)*c123_2[2](2,1);
  row(0,60) = c123_1[2](1,2)*c123_2[2](2,0)-c123_1[2](1,2)*c123_2[0](2,2)-c123_1[2](2,1)*c123_2[2](0,2)+c123_1[2](2,1)*c123_2[0](2,2)+c123_1[1](2,2)*c123_2[2](0,2)-c123_1[1](2,2)*c123_2[2](2,0);
  row(0,61) = c123_1[1](0,1)*c123_2[2](2,1)-c123_1[1](0,1)*c123_2[1](2,2)-c123_1[1](1,0)*c123_2[2](1,2)+c123_1[1](1,0)*c123_2[1](2,2)+c123_1[0](1,1)*c123_2[2](1,2)-c123_1[0](1,1)*c123_2[2](2,1);
  row(0,62) = c123_1[1](0,1)*c123_2[2](1,1)-c123_1[1](0,1)*c123_2[1](1,2)-c123_1[1](1,0)*c123_2[2](1,1)+c123_1[1](1,0)*c123_2[1](2,1)+c123_1[0](1,1)*c123_2[1](1,2)-c123_1[0](1,1)*c123_2[1](2,1);
  row(0,64) = c123_1[1](0,1)*c123_2[2](0,1)-c123_1[1](0,1)*c123_2[1](0,2)-c123_1[1](0,1)*c123_2[1](2,0)+c123_1[1](0,1)*c123_2[0](2,1)+c123_1[1](1,0)*c123_2[1](0,2)-c123_1[1](1,0)*c123_2[2](1,0)-c123_1[1](1,0)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[1](2,0)-c123_1[0](1,1)*c123_2[2](0,1)+c123_1[0](1,1)*c123_2[2](1,0)+c123_1[0](1,1)*c123_2[0](1,2)-c123_1[0](1,1)*c123_2[0](2,1);
  row(0,65) = -c123_1[1](0,1)*c123_2[1](1,0)+c123_1[1](0,1)*c123_2[0](1,1)+c123_1[1](1,0)*c123_2[1](0,1)-c123_1[1](1,0)*c123_2[0](1,1)-c123_1[0](1,1)*c123_2[1](0,1)+c123_1[0](1,1)*c123_2[1](1,0);
  row(0,66) = -c123_1[1](0,1)*c123_2[1](0,0)+c123_1[1](0,1)*c123_2[0](0,1)+c123_1[1](1,0)*c123_2[1](0,0)-c123_1[1](1,0)*c123_2[0](1,0)-c123_1[0](1,1)*c123_2[0](0,1)+c123_1[0](1,1)*c123_2[0](1,0);
  row(0,67) = -c123_1[2](0,1)*c123_2[2](2,1)+c123_1[2](0,1)*c123_2[1](2,2)-c123_1[1](0,2)*c123_2[2](2,1)+c123_1[1](0,2)*c123_2[1](2,2)+c123_1[2](1,0)*c123_2[2](1,2)-c123_1[2](1,0)*c123_2[1](2,2)-c123_1[0](1,2)*c123_2[2](1,2)+c123_1[0](1,2)*c123_2[2](2,1)+c123_1[1](2,0)*c123_2[2](1,2)-c123_1[1](2,0)*c123_2[1](2,2)-c123_1[0](2,1)*c123_2[2](1,2)+c123_1[0](2,1)*c123_2[2](2,1);
  row(0,68) = -c123_1[2](0,1)*c123_2[2](1,1)+c123_1[2](0,1)*c123_2[1](2,1)+c123_1[1](0,2)*c123_2[1](1,2)-c123_1[1](0,2)*c123_2[1](2,1)+c123_1[2](1,0)*c123_2[2](1,1)-c123_1[2](1,0)*c123_2[1](1,2)+c123_1[0](1,2)*c123_2[2](1,1)-c123_1[0](1,2)*c123_2[1](1,2)+c123_1[1](2,0)*c123_2[1](1,2)-c123_1[1](2,0)*c123_2[1](2,1)-c123_1[0](2,1)*c123_2[2](1,1)+c123_1[0](2,1)*c123_2[1](2,1);
  row(0,69) = -c123_1[2](0,1)*c123_2[2](0,1)+c123_1[2](0,1)*c123_2[1](2,0)+c123_1[1](0,2)*c123_2[1](0,2)-c123_1[1](0,2)*c123_2[0](2,1)-c123_1[2](1,0)*c123_2[1](0,2)+c123_1[2](1,0)*c123_2[2](1,0)+c123_1[0](1,2)*c123_2[2](0,1)-c123_1[0](1,2)*c123_2[0](1,2)+c123_1[1](2,0)*c123_2[0](1,2)-c123_1[1](2,0)*c123_2[1](2,0)-c123_1[0](2,1)*c123_2[2](1,0)+c123_1[0](2,1)*c123_2[0](2,1);
  row(0,70) = c123_1[2](0,2)*c123_2[2](2,1)-c123_1[2](0,2)*c123_2[1](2,2)-c123_1[2](2,0)*c123_2[2](1,2)+c123_1[2](2,0)*c123_2[1](2,2)+c123_1[0](2,2)*c123_2[2](1,2)-c123_1[0](2,2)*c123_2[2](2,1);
  row(0,71) = c123_1[2](0,1)*c123_2[1](1,2)-c123_1[2](0,1)*c123_2[1](2,1)-c123_1[1](0,2)*c123_2[2](1,1)+c123_1[1](0,2)*c123_2[1](2,1)+c123_1[2](1,0)*c123_2[1](1,2)-c123_1[2](1,0)*c123_2[1](2,1)-c123_1[0](1,2)*c123_2[2](1,1)+c123_1[0](1,2)*c123_2[1](2,1)+c123_1[1](2,0)*c123_2[2](1,1)-c123_1[1](2,0)*c123_2[1](1,2)+c123_1[0](2,1)*c123_2[2](1,1)-c123_1[0](2,1)*c123_2[1](1,2);
  row(0,73) = -c123_1[2](0,1)*c123_2[1](0,1)+c123_1[2](0,1)*c123_2[1](1,0)+c123_1[1](0,2)*c123_2[1](0,1)-c123_1[1](0,2)*c123_2[0](1,1)-c123_1[2](1,0)*c123_2[1](0,1)+c123_1[2](1,0)*c123_2[1](1,0)+c123_1[0](1,2)*c123_2[1](0,1)-c123_1[0](1,2)*c123_2[0](1,1)-c123_1[1](2,0)*c123_2[1](1,0)+c123_1[1](2,0)*c123_2[0](1,1)-c123_1[0](2,1)*c123_2[1](1,0)+c123_1[0](2,1)*c123_2[0](1,1);
  row(0,74) = c123_1[2](0,2)*c123_2[2](1,1)-c123_1[2](0,2)*c123_2[1](1,2)-c123_1[2](2,0)*c123_2[2](1,1)+c123_1[2](2,0)*c123_2[1](2,1)+c123_1[0](2,2)*c123_2[1](1,2)-c123_1[0](2,2)*c123_2[1](2,1);
  row(0,76) = c123_1[2](0,1)*c123_2[1](0,2)-c123_1[2](0,1)*c123_2[0](2,1)-c123_1[1](0,2)*c123_2[2](0,1)+c123_1[1](0,2)*c123_2[1](2,0)+c123_1[2](1,0)*c123_2[0](1,2)-c123_1[2](1,0)*c123_2[1](2,0)-c123_1[0](1,2)*c123_2[2](1,0)+c123_1[0](1,2)*c123_2[0](2,1)-c123_1[1](2,0)*c123_2[1](0,2)+c123_1[1](2,0)*c123_2[2](1,0)+c123_1[0](2,1)*c123_2[2](0,1)-c123_1[0](2,1)*c123_2[0](1,2);
  row(0,77) = c123_1[2](0,1)*c123_2[1](0,1)-c123_1[2](0,1)*c123_2[0](1,1)-c123_1[1](0,2)*c123_2[1](0,1)+c123_1[1](0,2)*c123_2[1](1,0)-c123_1[2](1,0)*c123_2[1](1,0)+c123_1[2](1,0)*c123_2[0](1,1)-c123_1[0](1,2)*c123_2[1](1,0)+c123_1[0](1,2)*c123_2[0](1,1)-c123_1[1](2,0)*c123_2[1](0,1)+c123_1[1](2,0)*c123_2[1](1,0)+c123_1[0](2,1)*c123_2[1](0,1)-c123_1[0](2,1)*c123_2[0](1,1);
  row(0,78) = c123_1[2](0,1)*c123_2[1](0,0)-c123_1[2](0,1)*c123_2[0](0,1)+c123_1[1](0,2)*c123_2[1](0,0)-c123_1[1](0,2)*c123_2[0](0,1)-c123_1[2](1,0)*c123_2[1](0,0)+c123_1[2](1,0)*c123_2[0](1,0)+c123_1[0](1,2)*c123_2[0](0,1)-c123_1[0](1,2)*c123_2[0](1,0)-c123_1[1](2,0)*c123_2[1](0,0)+c123_1[1](2,0)*c123_2[0](1,0)+c123_1[0](2,1)*c123_2[0](0,1)-c123_1[0](2,1)*c123_2[0](1,0);
  row(0,79) = c123_1[2](0,2)*c123_2[2](0,1)-c123_1[2](0,2)*c123_2[1](0,2)-c123_1[2](0,2)*c123_2[1](2,0)+c123_1[2](0,2)*c123_2[0](2,1)+c123_1[2](2,0)*c123_2[1](0,2)-c123_1[2](2,0)*c123_2[2](1,0)-c123_1[2](2,0)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[1](2,0)-c123_1[0](2,2)*c123_2[2](0,1)+c123_1[0](2,2)*c123_2[2](1,0)+c123_1[0](2,2)*c123_2[0](1,2)-c123_1[0](2,2)*c123_2[0](2,1);
  row(0,80) = -c123_1[2](0,2)*c123_2[1](1,0)+c123_1[2](0,2)*c123_2[0](1,1)+c123_1[2](2,0)*c123_2[1](0,1)-c123_1[2](2,0)*c123_2[0](1,1)-c123_1[0](2,2)*c123_2[1](0,1)+c123_1[0](2,2)*c123_2[1](1,0);
  row(0,81) = c123_1[2](0,2)*c123_2[0](0,1)-c123_1[2](0,2)*c123_2[1](0,0)+c123_1[2](2,0)*c123_2[1](0,0)-c123_1[2](2,0)*c123_2[0](1,0)-c123_1[0](2,2)*c123_2[0](0,1)+c123_1[0](2,2)*c123_2[0](1,0);
  row(0,82) = -c123_1[2](1,1)*c123_2[2](1,2)+c123_1[2](1,1)*c123_2[2](2,1)+c123_1[1](1,2)*c123_2[2](1,2)-c123_1[1](1,2)*c123_2[1](2,2)-c123_1[1](2,1)*c123_2[2](2,1)+c123_1[1](2,1)*c123_2[1](2,2);
  row(0,83) = c123_1[2](1,1)*c123_2[1](1,2)-c123_1[2](1,1)*c123_2[1](2,1)-c123_1[1](1,2)*c123_2[2](1,1)+c123_1[1](1,2)*c123_2[1](2,1)+c123_1[1](2,1)*c123_2[2](1,1)-c123_1[1](2,1)*c123_2[1](1,2);
  row(0,84) = c123_1[2](1,1)*c123_2[2](0,1)+c123_1[2](1,1)*c123_2[1](0,2)-c123_1[2](1,1)*c123_2[2](1,0)-c123_1[2](1,1)*c123_2[1](2,0)-c123_1[1](1,2)*c123_2[2](0,1)-c123_1[1](1,2)*c123_2[1](0,2)+c123_1[1](1,2)*c123_2[0](1,2)+c123_1[1](1,2)*c123_2[0](2,1)+c123_1[1](2,1)*c123_2[2](1,0)-c123_1[1](2,1)*c123_2[0](1,2)+c123_1[1](2,1)*c123_2[1](2,0)-c123_1[1](2,1)*c123_2[0](2,1);
  row(0,85) = -c123_1[2](1,2)*c123_2[2](2,1)+c123_1[2](1,2)*c123_2[1](2,2)+c123_1[2](2,1)*c123_2[2](1,2)-c123_1[2](2,1)*c123_2[1](2,2)-c123_1[1](2,2)*c123_2[2](1,2)+c123_1[1](2,2)*c123_2[2](2,1);
  row(0,86) = c123_1[2](1,2)*c123_2[2](1,1)-c123_1[2](1,2)*c123_2[1](1,2)-c123_1[2](2,1)*c123_2[2](1,1)+c123_1[2](2,1)*c123_2[1](2,1)+c123_1[1](2,2)*c123_2[1](1,2)-c123_1[1](2,2)*c123_2[1](2,1);
  row(0,87) = c123_1[2](1,2)*c123_2[2](1,0)-c123_1[2](1,2)*c123_2[0](1,2)+c123_1[2](1,2)*c123_2[1](2,0)-c123_1[2](1,2)*c123_2[0](2,1)-c123_1[2](2,1)*c123_2[2](0,1)-c123_1[2](2,1)*c123_2[1](0,2)+c123_1[2](2,1)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[0](2,1)+c123_1[1](2,2)*c123_2[2](0,1)+c123_1[1](2,2)*c123_2[1](0,2)-c123_1[1](2,2)*c123_2[2](1,0)-c123_1[1](2,2)*c123_2[1](2,0);
  row(0,89) = -c123_1[2](1,1)*c123_2[1](1,2)+c123_1[2](1,1)*c123_2[1](2,1)+c123_1[1](1,2)*c123_2[2](1,1)-c123_1[1](1,2)*c123_2[1](2,1)-c123_1[1](2,1)*c123_2[2](1,1)+c123_1[1](2,1)*c123_2[1](1,2);
  row(0,91) = c123_1[2](1,1)*c123_2[1](0,1)-c123_1[2](1,1)*c123_2[1](1,0)-c123_1[1](1,2)*c123_2[1](0,1)+c123_1[1](1,2)*c123_2[0](1,1)+c123_1[1](2,1)*c123_2[1](1,0)-c123_1[1](2,1)*c123_2[0](1,1);
  row(0,92) = -c123_1[2](1,2)*c123_2[2](1,1)+c123_1[2](1,2)*c123_2[1](1,2)+c123_1[2](2,1)*c123_2[2](1,1)-c123_1[2](2,1)*c123_2[1](2,1)-c123_1[1](2,2)*c123_2[1](1,2)+c123_1[1](2,2)*c123_2[1](2,1);
  row(0,94) = c123_1[2](1,2)*c123_2[1](1,0)-c123_1[2](1,2)*c123_2[0](1,1)-c123_1[2](2,1)*c123_2[1](0,1)+c123_1[2](2,1)*c123_2[0](1,1)+c123_1[1](2,2)*c123_2[1](0,1)-c123_1[1](2,2)*c123_2[1](1,0);
  row(0,97) = c123_1[1](0,1)*c123_2[2](2,0)-c123_1[1](0,1)*c123_2[0](2,2)-c123_1[1](1,0)*c123_2[2](0,2)+c123_1[1](1,0)*c123_2[0](2,2)+c123_1[0](1,1)*c123_2[2](0,2)-c123_1[0](1,1)*c123_2[2](2,0);
  row(0,98) = c123_1[1](0,1)*c123_2[2](1,0)-c123_1[1](0,1)*c123_2[0](1,2)+c123_1[1](0,1)*c123_2[1](2,0)-c123_1[1](0,1)*c123_2[0](2,1)-c123_1[1](1,0)*c123_2[2](0,1)-c123_1[1](1,0)*c123_2[1](0,2)+c123_1[1](1,0)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[0](2,1)+c123_1[0](1,1)*c123_2[2](0,1)+c123_1[0](1,1)*c123_2[1](0,2)-c123_1[0](1,1)*c123_2[2](1,0)-c123_1[0](1,1)*c123_2[1](2,0);
  row(0,99) = c123_1[1](0,1)*c123_2[1](1,0)-c123_1[1](0,1)*c123_2[0](1,1)-c123_1[1](1,0)*c123_2[1](0,1)+c123_1[1](1,0)*c123_2[0](1,1)+c123_1[0](1,1)*c123_2[1](0,1)-c123_1[0](1,1)*c123_2[1](1,0);
  row(0,100) = c123_1[1](0,1)*c123_2[2](0,0)-c123_1[1](0,1)*c123_2[0](0,2)-c123_1[1](1,0)*c123_2[2](0,0)+c123_1[1](1,0)*c123_2[0](2,0)+c123_1[0](1,1)*c123_2[0](0,2)-c123_1[0](1,1)*c123_2[0](2,0);
  row(0,101) = c123_1[1](0,1)*c123_2[1](0,0)-c123_1[1](0,1)*c123_2[0](0,1)-c123_1[1](1,0)*c123_2[1](0,0)+c123_1[1](1,0)*c123_2[0](1,0)+c123_1[0](1,1)*c123_2[0](0,1)-c123_1[0](1,1)*c123_2[0](1,0);
  row(0,103) = -c123_1[2](0,1)*c123_2[2](2,0)+c123_1[2](0,1)*c123_2[0](2,2)-c123_1[1](0,2)*c123_2[2](2,0)+c123_1[1](0,2)*c123_2[0](2,2)+c123_1[2](1,0)*c123_2[2](0,2)-c123_1[2](1,0)*c123_2[0](2,2)-c123_1[0](1,2)*c123_2[2](0,2)+c123_1[0](1,2)*c123_2[2](2,0)+c123_1[1](2,0)*c123_2[2](0,2)-c123_1[1](2,0)*c123_2[0](2,2)-c123_1[0](2,1)*c123_2[2](0,2)+c123_1[0](2,1)*c123_2[2](2,0);
  row(0,104) = -c123_1[2](0,1)*c123_2[2](1,0)+c123_1[2](0,1)*c123_2[0](2,1)+c123_1[1](0,2)*c123_2[0](1,2)-c123_1[1](0,2)*c123_2[1](2,0)+c123_1[2](1,0)*c123_2[2](0,1)-c123_1[2](1,0)*c123_2[0](1,2)-c123_1[0](1,2)*c123_2[1](0,2)+c123_1[0](1,2)*c123_2[2](1,0)+c123_1[1](2,0)*c123_2[1](0,2)-c123_1[1](2,0)*c123_2[0](2,1)-c123_1[0](2,1)*c123_2[2](0,1)+c123_1[0](2,1)*c123_2[1](2,0);
  row(0,105) = -c123_1[2](0,1)*c123_2[2](0,0)+c123_1[2](0,1)*c123_2[0](2,0)+c123_1[1](0,2)*c123_2[0](0,2)-c123_1[1](0,2)*c123_2[0](2,0)+c123_1[2](1,0)*c123_2[2](0,0)-c123_1[2](1,0)*c123_2[0](0,2)+c123_1[0](1,2)*c123_2[2](0,0)-c123_1[0](1,2)*c123_2[0](0,2)+c123_1[1](2,0)*c123_2[0](0,2)-c123_1[1](2,0)*c123_2[0](2,0)-c123_1[0](2,1)*c123_2[2](0,0)+c123_1[0](2,1)*c123_2[0](2,0);
  row(0,106) = c123_1[2](0,2)*c123_2[2](2,0)-c123_1[2](0,2)*c123_2[0](2,2)-c123_1[2](2,0)*c123_2[2](0,2)+c123_1[2](2,0)*c123_2[0](2,2)+c123_1[0](2,2)*c123_2[2](0,2)-c123_1[0](2,2)*c123_2[2](2,0);
  row(0,107) = c123_1[2](0,1)*c123_2[0](1,2)-c123_1[2](0,1)*c123_2[1](2,0)-c123_1[1](0,2)*c123_2[2](1,0)+c123_1[1](0,2)*c123_2[0](2,1)+c123_1[2](1,0)*c123_2[1](0,2)-c123_1[2](1,0)*c123_2[0](2,1)-c123_1[0](1,2)*c123_2[2](0,1)+c123_1[0](1,2)*c123_2[1](2,0)+c123_1[1](2,0)*c123_2[2](0,1)-c123_1[1](2,0)*c123_2[0](1,2)-c123_1[0](2,1)*c123_2[1](0,2)+c123_1[0](2,1)*c123_2[2](1,0);
  row(0,108) = -c123_1[2](0,1)*c123_2[1](1,0)+c123_1[2](0,1)*c123_2[0](1,1)-c123_1[1](0,2)*c123_2[1](1,0)+c123_1[1](0,2)*c123_2[0](1,1)+c123_1[2](1,0)*c123_2[1](0,1)-c123_1[2](1,0)*c123_2[0](1,1)-c123_1[0](1,2)*c123_2[1](0,1)+c123_1[0](1,2)*c123_2[1](1,0)+c123_1[1](2,0)*c123_2[1](0,1)-c123_1[1](2,0)*c123_2[0](1,1)-c123_1[0](2,1)*c123_2[1](0,1)+c123_1[0](2,1)*c123_2[1](1,0);
  row(0,109) = -c123_1[2](0,1)*c123_2[1](0,0)+c123_1[2](0,1)*c123_2[0](1,0)+c123_1[1](0,2)*c123_2[0](0,1)-c123_1[1](0,2)*c123_2[0](1,0)+c123_1[2](1,0)*c123_2[1](0,0)-c123_1[2](1,0)*c123_2[0](0,1)+c123_1[0](1,2)*c123_2[1](0,0)-c123_1[0](1,2)*c123_2[0](0,1)+c123_1[1](2,0)*c123_2[0](0,1)-c123_1[1](2,0)*c123_2[0](1,0)-c123_1[0](2,1)*c123_2[1](0,0)+c123_1[0](2,1)*c123_2[0](1,0);
  row(0,110) = c123_1[2](0,2)*c123_2[2](1,0)-c123_1[2](0,2)*c123_2[0](1,2)+c123_1[2](0,2)*c123_2[1](2,0)-c123_1[2](0,2)*c123_2[0](2,1)-c123_1[2](2,0)*c123_2[2](0,1)-c123_1[2](2,0)*c123_2[1](0,2)+c123_1[2](2,0)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[0](2,1)+c123_1[0](2,2)*c123_2[2](0,1)+c123_1[0](2,2)*c123_2[1](0,2)-c123_1[0](2,2)*c123_2[2](1,0)-c123_1[0](2,2)*c123_2[1](2,0);
  row(0,111) = c123_1[2](0,2)*c123_2[1](1,0)-c123_1[2](0,2)*c123_2[0](1,1)-c123_1[2](2,0)*c123_2[1](0,1)+c123_1[2](2,0)*c123_2[0](1,1)+c123_1[0](2,2)*c123_2[1](0,1)-c123_1[0](2,2)*c123_2[1](1,0);
  row(0,112) = c123_1[2](0,1)*c123_2[0](0,2)-c123_1[2](0,1)*c123_2[0](2,0)-c123_1[1](0,2)*c123_2[2](0,0)+c123_1[1](0,2)*c123_2[0](2,0)+c123_1[2](1,0)*c123_2[0](0,2)-c123_1[2](1,0)*c123_2[0](2,0)-c123_1[0](1,2)*c123_2[2](0,0)+c123_1[0](1,2)*c123_2[0](2,0)+c123_1[1](2,0)*c123_2[2](0,0)-c123_1[1](2,0)*c123_2[0](0,2)+c123_1[0](2,1)*c123_2[2](0,0)-c123_1[0](2,1)*c123_2[0](0,2);
  row(0,113) = c123_1[2](0,1)*c123_2[0](0,1)-c123_1[2](0,1)*c123_2[0](1,0)-c123_1[1](0,2)*c123_2[1](0,0)+c123_1[1](0,2)*c123_2[0](1,0)+c123_1[2](1,0)*c123_2[0](0,1)-c123_1[2](1,0)*c123_2[0](1,0)-c123_1[0](1,2)*c123_2[1](0,0)+c123_1[0](1,2)*c123_2[0](1,0)+c123_1[1](2,0)*c123_2[1](0,0)-c123_1[1](2,0)*c123_2[0](0,1)+c123_1[0](2,1)*c123_2[1](0,0)-c123_1[0](2,1)*c123_2[0](0,1);
  row(0,115) = c123_1[2](0,2)*c123_2[2](0,0)-c123_1[2](0,2)*c123_2[0](0,2)-c123_1[2](2,0)*c123_2[2](0,0)+c123_1[2](2,0)*c123_2[0](2,0)+c123_1[0](2,2)*c123_2[0](0,2)-c123_1[0](2,2)*c123_2[0](2,0);
  row(0,116) = c123_1[2](0,2)*c123_2[1](0,0)-c123_1[2](0,2)*c123_2[0](0,1)-c123_1[2](2,0)*c123_2[1](0,0)+c123_1[2](2,0)*c123_2[0](1,0)+c123_1[0](2,2)*c123_2[0](0,1)-c123_1[0](2,2)*c123_2[0](1,0);
  row(0,118) = -c123_1[2](1,1)*c123_2[2](0,2)+c123_1[2](1,1)*c123_2[2](2,0)+c123_1[1](1,2)*c123_2[2](0,2)-c123_1[1](1,2)*c123_2[0](2,2)-c123_1[1](2,1)*c123_2[2](2,0)+c123_1[1](2,1)*c123_2[0](2,2);
  row(0,119) = -c123_1[2](1,1)*c123_2[2](0,1)+c123_1[2](1,1)*c123_2[2](1,0)+c123_1[2](1,1)*c123_2[0](1,2)-c123_1[2](1,1)*c123_2[0](2,1)+c123_1[1](1,2)*c123_2[1](0,2)-c123_1[1](1,2)*c123_2[2](1,0)-c123_1[1](1,2)*c123_2[0](1,2)+c123_1[1](1,2)*c123_2[1](2,0)+c123_1[1](2,1)*c123_2[2](0,1)-c123_1[1](2,1)*c123_2[1](0,2)-c123_1[1](2,1)*c123_2[1](2,0)+c123_1[1](2,1)*c123_2[0](2,1);
  row(0,120) = c123_1[2](1,1)*c123_2[0](0,2)-c123_1[2](1,1)*c123_2[0](2,0)-c123_1[1](1,2)*c123_2[2](0,0)+c123_1[1](1,2)*c123_2[0](2,0)+c123_1[1](2,1)*c123_2[2](0,0)-c123_1[1](2,1)*c123_2[0](0,2);
  row(0,121) = -c123_1[2](1,2)*c123_2[2](2,0)+c123_1[2](1,2)*c123_2[0](2,2)+c123_1[2](2,1)*c123_2[2](0,2)-c123_1[2](2,1)*c123_2[0](2,2)-c123_1[1](2,2)*c123_2[2](0,2)+c123_1[1](2,2)*c123_2[2](2,0);
  row(0,122) = c123_1[2](1,2)*c123_2[2](0,1)-c123_1[2](1,2)*c123_2[1](0,2)-c123_1[2](1,2)*c123_2[1](2,0)+c123_1[2](1,2)*c123_2[0](2,1)+c123_1[2](2,1)*c123_2[1](0,2)-c123_1[2](2,1)*c123_2[2](1,0)-c123_1[2](2,1)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[1](2,0)-c123_1[1](2,2)*c123_2[2](0,1)+c123_1[1](2,2)*c123_2[2](1,0)+c123_1[1](2,2)*c123_2[0](1,2)-c123_1[1](2,2)*c123_2[0](2,1);
  row(0,123) = c123_1[2](1,2)*c123_2[2](0,0)-c123_1[2](1,2)*c123_2[0](0,2)-c123_1[2](2,1)*c123_2[2](0,0)+c123_1[2](2,1)*c123_2[0](2,0)+c123_1[1](2,2)*c123_2[0](0,2)-c123_1[1](2,2)*c123_2[0](2,0);
  row(0,125) = -c123_1[2](1,1)*c123_2[1](0,2)-c123_1[2](1,1)*c123_2[0](1,2)+c123_1[2](1,1)*c123_2[1](2,0)+c123_1[2](1,1)*c123_2[0](2,1)+c123_1[1](1,2)*c123_2[2](0,1)+c123_1[1](1,2)*c123_2[2](1,0)-c123_1[1](1,2)*c123_2[1](2,0)-c123_1[1](1,2)*c123_2[0](2,1)-c123_1[1](2,1)*c123_2[2](0,1)+c123_1[1](2,1)*c123_2[1](0,2)-c123_1[1](2,1)*c123_2[2](1,0)+c123_1[1](2,1)*c123_2[0](1,2);
  row(0,126) = -c123_1[2](1,1)*c123_2[1](0,1)+c123_1[2](1,1)*c123_2[1](1,0)+c123_1[1](1,2)*c123_2[1](0,1)-c123_1[1](1,2)*c123_2[0](1,1)-c123_1[1](2,1)*c123_2[1](1,0)+c123_1[1](2,1)*c123_2[0](1,1);
  row(0,127) = c123_1[2](1,1)*c123_2[0](0,1)-c123_1[2](1,1)*c123_2[0](1,0)-c123_1[1](1,2)*c123_2[1](0,0)+c123_1[1](1,2)*c123_2[0](1,0)+c123_1[1](2,1)*c123_2[1](0,0)-c123_1[1](2,1)*c123_2[0](0,1);
  row(0,128) = -c123_1[2](1,2)*c123_2[2](0,1)+c123_1[2](1,2)*c123_2[1](0,2)-c123_1[2](1,2)*c123_2[2](1,0)+c123_1[2](1,2)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[2](0,1)+c123_1[2](2,1)*c123_2[2](1,0)-c123_1[2](2,1)*c123_2[1](2,0)-c123_1[2](2,1)*c123_2[0](2,1)-c123_1[1](2,2)*c123_2[1](0,2)-c123_1[1](2,2)*c123_2[0](1,2)+c123_1[1](2,2)*c123_2[1](2,0)+c123_1[1](2,2)*c123_2[0](2,1);
  row(0,129) = -c123_1[2](1,2)*c123_2[1](1,0)+c123_1[2](1,2)*c123_2[0](1,1)+c123_1[2](2,1)*c123_2[1](0,1)-c123_1[2](2,1)*c123_2[0](1,1)-c123_1[1](2,2)*c123_2[1](0,1)+c123_1[1](2,2)*c123_2[1](1,0);
  row(0,130) = c123_1[2](1,2)*c123_2[1](0,0)-c123_1[2](1,2)*c123_2[0](0,1)-c123_1[2](2,1)*c123_2[1](0,0)+c123_1[2](2,1)*c123_2[0](1,0)+c123_1[1](2,2)*c123_2[0](0,1)-c123_1[1](2,2)*c123_2[0](1,0);
  row(0,133) = -c123_1[2](1,1)*c123_2[0](0,2)+c123_1[2](1,1)*c123_2[0](2,0)+c123_1[1](1,2)*c123_2[2](0,0)-c123_1[1](1,2)*c123_2[0](2,0)-c123_1[1](2,1)*c123_2[2](0,0)+c123_1[1](2,1)*c123_2[0](0,2);
  row(0,134) = -c123_1[2](1,1)*c123_2[0](0,1)+c123_1[2](1,1)*c123_2[0](1,0)+c123_1[1](1,2)*c123_2[1](0,0)-c123_1[1](1,2)*c123_2[0](1,0)-c123_1[1](2,1)*c123_2[1](0,0)+c123_1[1](2,1)*c123_2[0](0,1);
  row(0,136) = -c123_1[2](1,2)*c123_2[2](0,0)+c123_1[2](1,2)*c123_2[0](0,2)+c123_1[2](2,1)*c123_2[2](0,0)-c123_1[2](2,1)*c123_2[0](2,0)-c123_1[1](2,2)*c123_2[0](0,2)+c123_1[1](2,2)*c123_2[0](2,0);
  row(0,137) = -c123_1[2](1,2)*c123_2[1](0,0)+c123_1[2](1,2)*c123_2[0](0,1)+c123_1[2](2,1)*c123_2[1](0,0)-c123_1[2](2,1)*c123_2[0](1,0)-c123_1[1](2,2)*c123_2[0](0,1)+c123_1[1](2,2)*c123_2[0](1,0);
  return row;
}